

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  uint uVar1;
  float *pfVar2;
  Geometry *pGVar3;
  RTCRayQueryContext *pRVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  byte bVar26;
  bool bVar27;
  int iVar28;
  float *vertices;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 (*pauVar32) [32];
  ulong uVar33;
  uint uVar34;
  ulong *puVar35;
  NodeRef root;
  long lVar36;
  byte bVar37;
  undefined4 uVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  vfloat_impl<8> vVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  vfloat_impl<8> vVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [64];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar84 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar85 [64];
  float fVar86;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar87 [64];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  Vec3vf<8> Ng;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  uint local_2bf4;
  Precalculations local_2bc9;
  size_t local_2bc8;
  RTCFilterFunctionNArguments local_2bc0;
  RayK<8> *local_2b90;
  undefined4 local_2b88;
  int local_2b84;
  undefined1 local_2b80 [32];
  undefined1 (*local_2b50) [32];
  long local_2b48;
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [32];
  BVH *local_2b00;
  Intersectors *local_2af8;
  long local_2af0;
  Scene *local_2ae8;
  undefined1 local_2ae0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2ac0;
  RTCRayQueryContext local_2aa0 [4];
  RTCRayN local_2a80 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2a60;
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  uint local_2980;
  uint uStack_297c;
  uint uStack_2978;
  uint uStack_2974;
  uint uStack_2970;
  uint uStack_296c;
  uint uStack_2968;
  uint uStack_2964;
  uint local_2960;
  uint uStack_295c;
  uint uStack_2958;
  uint uStack_2954;
  uint uStack_2950;
  uint uStack_294c;
  uint uStack_2948;
  uint uStack_2944;
  int local_2940 [8];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2920;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_28e0;
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [8];
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  undefined1 local_2800 [8];
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  int local_27c0;
  int iStack_27bc;
  int iStack_27b8;
  int iStack_27b4;
  int iStack_27b0;
  int iStack_27ac;
  int iStack_27a8;
  int iStack_27a4;
  uint local_27a0;
  uint uStack_279c;
  uint uStack_2798;
  uint uStack_2794;
  uint uStack_2790;
  uint uStack_278c;
  uint uStack_2788;
  uint uStack_2784;
  uint local_2780;
  uint uStack_277c;
  uint uStack_2778;
  uint uStack_2774;
  uint uStack_2770;
  uint uStack_276c;
  uint uStack_2768;
  uint uStack_2764;
  uint local_2760;
  uint uStack_275c;
  uint uStack_2758;
  uint uStack_2754;
  uint uStack_2750;
  uint uStack_274c;
  uint uStack_2748;
  uint uStack_2744;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  uint local_1e60;
  uint uStack_1e5c;
  uint uStack_1e58;
  uint uStack_1e54;
  uint uStack_1e50;
  uint uStack_1e4c;
  uint uStack_1e48;
  uint uStack_1e44;
  undefined1 local_1e40 [7696];
  undefined1 auVar83 [32];
  
  local_2b00 = (BVH *)This->ptr;
  local_2608 = (local_2b00->root).ptr;
  if (local_2608 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar41 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar74 = ZEXT816(0) << 0x40;
      uVar39 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar74),5);
      uVar30 = vpcmpeqd_avx512vl(auVar41,(undefined1  [32])valid_i->field_0);
      uVar39 = uVar39 & uVar30;
      bVar26 = (byte)uVar39;
      if (bVar26 != 0) {
        local_28e0._0_8_ = *(undefined8 *)ray;
        local_28e0._8_8_ = *(undefined8 *)(ray + 8);
        local_28e0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_28e0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_28e0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_28e0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_28e0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_28e0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_28e0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_28e0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_28e0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_28e0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2880 = *(undefined1 (*) [32])(ray + 0x80);
        local_2860 = *(undefined1 (*) [32])(ray + 0xa0);
        local_2840 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar96 = ZEXT3264(auVar41);
        vandps_avx512vl(local_2880,auVar41);
        auVar79._8_4_ = 0x219392ef;
        auVar79._0_8_ = 0x219392ef219392ef;
        auVar79._12_4_ = 0x219392ef;
        auVar79._16_4_ = 0x219392ef;
        auVar79._20_4_ = 0x219392ef;
        auVar79._24_4_ = 0x219392ef;
        auVar79._28_4_ = 0x219392ef;
        uVar30 = vcmpps_avx512vl(auVar41,auVar79,1);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar97 = ZEXT3264(auVar42);
        auVar43 = vdivps_avx512vl(auVar42,local_2880);
        vandps_avx512vl(local_2860,auVar41);
        uVar31 = vcmpps_avx512vl(auVar43,auVar79,1);
        auVar44 = vdivps_avx512vl(auVar42,local_2860);
        vandps_avx512vl(local_2840,auVar41);
        uVar33 = vcmpps_avx512vl(auVar44,auVar79,1);
        auVar41 = vdivps_avx512vl(auVar42,local_2840);
        auVar80 = ZEXT3264(CONCAT428(0x5d5e0b6b,
                                     CONCAT424(0x5d5e0b6b,
                                               CONCAT420(0x5d5e0b6b,
                                                         CONCAT416(0x5d5e0b6b,
                                                                   CONCAT412(0x5d5e0b6b,
                                                                             CONCAT48(0x5d5e0b6b,
                                                                                                                                                                            
                                                  0x5d5e0b6b5d5e0b6b)))))));
        bVar27 = (bool)((byte)uVar30 & 1);
        local_2820._0_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._0_4_;
        bVar27 = (bool)((byte)(uVar30 >> 1) & 1);
        local_2820._4_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._4_4_;
        bVar27 = (bool)((byte)(uVar30 >> 2) & 1);
        fStack_2818 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._8_4_);
        bVar27 = (bool)((byte)(uVar30 >> 3) & 1);
        fStack_2814 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._12_4_);
        bVar27 = (bool)((byte)(uVar30 >> 4) & 1);
        fStack_2810 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._16_4_);
        bVar27 = (bool)((byte)(uVar30 >> 5) & 1);
        fStack_280c = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._20_4_);
        bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
        fStack_2808 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._24_4_);
        bVar27 = SUB81(uVar30 >> 7,0);
        register0x00000918 = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._28_4_;
        bVar27 = (bool)((byte)uVar31 & 1);
        local_2800._0_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar44._0_4_;
        bVar27 = (bool)((byte)(uVar31 >> 1) & 1);
        local_2800._4_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar44._4_4_;
        bVar27 = (bool)((byte)(uVar31 >> 2) & 1);
        fStack_27f8 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar44._8_4_);
        bVar27 = (bool)((byte)(uVar31 >> 3) & 1);
        fStack_27f4 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar44._12_4_);
        bVar27 = (bool)((byte)(uVar31 >> 4) & 1);
        fStack_27f0 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar44._16_4_);
        bVar27 = (bool)((byte)(uVar31 >> 5) & 1);
        fStack_27ec = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar44._20_4_);
        bVar27 = (bool)((byte)(uVar31 >> 6) & 1);
        fStack_27e8 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar44._24_4_);
        bVar27 = SUB81(uVar31 >> 7,0);
        register0x00000918 = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar44._28_4_;
        bVar27 = (bool)((byte)uVar33 & 1);
        local_27e0._0_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar41._0_4_;
        bVar27 = (bool)((byte)(uVar33 >> 1) & 1);
        local_27e0._4_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar41._4_4_;
        bVar27 = (bool)((byte)(uVar33 >> 2) & 1);
        fStack_27d8 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar41._8_4_);
        bVar27 = (bool)((byte)(uVar33 >> 3) & 1);
        fStack_27d4 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar41._12_4_);
        bVar27 = (bool)((byte)(uVar33 >> 4) & 1);
        fStack_27d0 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar41._16_4_);
        bVar27 = (bool)((byte)(uVar33 >> 5) & 1);
        fStack_27cc = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar41._20_4_);
        bVar27 = (bool)((byte)(uVar33 >> 6) & 1);
        fStack_27c8 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar41._24_4_);
        bVar27 = SUB81(uVar33 >> 7,0);
        register0x00000918 = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar41._28_4_;
        uVar30 = vcmpps_avx512vl(_local_2820,ZEXT1632(auVar74),1);
        auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x10));
        local_27c0 = (uint)((byte)uVar30 & 1) * auVar41._0_4_;
        iStack_27bc = (uint)((byte)(uVar30 >> 1) & 1) * auVar41._4_4_;
        iStack_27b8 = (uint)((byte)(uVar30 >> 2) & 1) * auVar41._8_4_;
        iStack_27b4 = (uint)((byte)(uVar30 >> 3) & 1) * auVar41._12_4_;
        iStack_27b0 = (uint)((byte)(uVar30 >> 4) & 1) * auVar41._16_4_;
        iStack_27ac = (uint)((byte)(uVar30 >> 5) & 1) * auVar41._20_4_;
        iStack_27a8 = (uint)((byte)(uVar30 >> 6) & 1) * auVar41._24_4_;
        iStack_27a4 = (uint)(byte)(uVar30 >> 7) * auVar41._28_4_;
        auVar42 = ZEXT1632(auVar74);
        uVar30 = vcmpps_avx512vl(_local_2800,auVar42,5);
        auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        bVar27 = (bool)((byte)uVar30 & 1);
        local_27a0 = (uint)bVar27 * auVar41._0_4_ | (uint)!bVar27 * 0x30;
        bVar27 = (bool)((byte)(uVar30 >> 1) & 1);
        uStack_279c = (uint)bVar27 * auVar41._4_4_ | (uint)!bVar27 * 0x30;
        bVar27 = (bool)((byte)(uVar30 >> 2) & 1);
        uStack_2798 = (uint)bVar27 * auVar41._8_4_ | (uint)!bVar27 * 0x30;
        bVar27 = (bool)((byte)(uVar30 >> 3) & 1);
        uStack_2794 = (uint)bVar27 * auVar41._12_4_ | (uint)!bVar27 * 0x30;
        bVar27 = (bool)((byte)(uVar30 >> 4) & 1);
        uStack_2790 = (uint)bVar27 * auVar41._16_4_ | (uint)!bVar27 * 0x30;
        bVar27 = (bool)((byte)(uVar30 >> 5) & 1);
        uStack_278c = (uint)bVar27 * auVar41._20_4_ | (uint)!bVar27 * 0x30;
        bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
        uStack_2788 = (uint)bVar27 * auVar41._24_4_ | (uint)!bVar27 * 0x30;
        bVar27 = SUB81(uVar30 >> 7,0);
        uStack_2784 = (uint)bVar27 * auVar41._28_4_ | (uint)!bVar27 * 0x30;
        uVar30 = vcmpps_avx512vl(_local_27e0,auVar42,5);
        auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar27 = (bool)((byte)uVar30 & 1);
        local_2780 = (uint)bVar27 * auVar41._0_4_ | (uint)!bVar27 * 0x50;
        bVar27 = (bool)((byte)(uVar30 >> 1) & 1);
        uStack_277c = (uint)bVar27 * auVar41._4_4_ | (uint)!bVar27 * 0x50;
        bVar27 = (bool)((byte)(uVar30 >> 2) & 1);
        uStack_2778 = (uint)bVar27 * auVar41._8_4_ | (uint)!bVar27 * 0x50;
        bVar27 = (bool)((byte)(uVar30 >> 3) & 1);
        uStack_2774 = (uint)bVar27 * auVar41._12_4_ | (uint)!bVar27 * 0x50;
        bVar27 = (bool)((byte)(uVar30 >> 4) & 1);
        uStack_2770 = (uint)bVar27 * auVar41._16_4_ | (uint)!bVar27 * 0x50;
        bVar27 = (bool)((byte)(uVar30 >> 5) & 1);
        uStack_276c = (uint)bVar27 * auVar41._20_4_ | (uint)!bVar27 * 0x50;
        bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
        uStack_2768 = (uint)bVar27 * auVar41._24_4_ | (uint)!bVar27 * 0x50;
        bVar27 = SUB81(uVar30 >> 7,0);
        uStack_2764 = (uint)bVar27 * auVar41._28_4_ | (uint)!bVar27 * 0x50;
        local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar98 = ZEXT3264(local_1e80);
        auVar41 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar42);
        local_2760 = (uint)(bVar26 & 1) * auVar41._0_4_ |
                     (uint)!(bool)(bVar26 & 1) * local_1e80._0_4_;
        bVar27 = (bool)((byte)(uVar39 >> 1) & 1);
        uStack_275c = (uint)bVar27 * auVar41._4_4_ | (uint)!bVar27 * local_1e80._4_4_;
        bVar27 = (bool)((byte)(uVar39 >> 2) & 1);
        uStack_2758 = (uint)bVar27 * auVar41._8_4_ | (uint)!bVar27 * local_1e80._8_4_;
        bVar27 = (bool)((byte)(uVar39 >> 3) & 1);
        uStack_2754 = (uint)bVar27 * auVar41._12_4_ | (uint)!bVar27 * local_1e80._12_4_;
        bVar27 = (bool)((byte)(uVar39 >> 4) & 1);
        uStack_2750 = (uint)bVar27 * auVar41._16_4_ | (uint)!bVar27 * local_1e80._16_4_;
        bVar27 = (bool)((byte)(uVar39 >> 5) & 1);
        uStack_274c = (uint)bVar27 * auVar41._20_4_ | (uint)!bVar27 * local_1e80._20_4_;
        bVar27 = (bool)((byte)(uVar39 >> 6) & 1);
        uStack_2748 = (uint)bVar27 * auVar41._24_4_ | (uint)!bVar27 * local_1e80._24_4_;
        bVar27 = SUB81(uVar39 >> 7,0);
        uStack_2744 = (uint)bVar27 * auVar41._28_4_ | (uint)!bVar27 * local_1e80._28_4_;
        local_2b88 = (undefined4)uVar39;
        auVar41 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar42);
        local_2740._0_4_ =
             (uint)(bVar26 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar26 & 1) * -0x800000;
        bVar27 = (bool)((byte)(uVar39 >> 1) & 1);
        local_2740._4_4_ = (uint)bVar27 * auVar41._4_4_ | (uint)!bVar27 * -0x800000;
        bVar27 = (bool)((byte)(uVar39 >> 2) & 1);
        local_2740._8_4_ = (uint)bVar27 * auVar41._8_4_ | (uint)!bVar27 * -0x800000;
        bVar27 = (bool)((byte)(uVar39 >> 3) & 1);
        local_2740._12_4_ = (uint)bVar27 * auVar41._12_4_ | (uint)!bVar27 * -0x800000;
        bVar27 = (bool)((byte)(uVar39 >> 4) & 1);
        local_2740._16_4_ = (uint)bVar27 * auVar41._16_4_ | (uint)!bVar27 * -0x800000;
        bVar27 = (bool)((byte)(uVar39 >> 5) & 1);
        local_2740._20_4_ = (uint)bVar27 * auVar41._20_4_ | (uint)!bVar27 * -0x800000;
        bVar27 = (bool)((byte)(uVar39 >> 6) & 1);
        local_2740._24_4_ = (uint)bVar27 * auVar41._24_4_ | (uint)!bVar27 * -0x800000;
        bVar27 = SUB81(uVar39 >> 7,0);
        local_2740._28_4_ = (uint)bVar27 * auVar41._28_4_ | (uint)!bVar27 * -0x800000;
        local_2bf4 = (uint)(byte)~bVar26;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar34 = 5;
        }
        else {
          uVar34 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2b90 = ray + 0x100;
        puVar35 = local_2600;
        pauVar32 = (undefined1 (*) [32])local_1e40;
        local_2610 = 0xfffffffffffffff8;
        local_1e60 = local_2760;
        uStack_1e5c = uStack_275c;
        uStack_1e58 = uStack_2758;
        uStack_1e54 = uStack_2754;
        uStack_1e50 = uStack_2750;
        uStack_1e4c = uStack_274c;
        uStack_1e48 = uStack_2748;
        uStack_1e44 = uStack_2744;
        local_2b50 = (undefined1 (*) [32])&local_2980;
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar99 = ZEXT3264(auVar41);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
        auVar100 = ZEXT3264(auVar41);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
        auVar101 = ZEXT3264(auVar41);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar95 = ZEXT3264(auVar41);
        local_2af8 = This;
LAB_01d07ddc:
        do {
          do {
            root.ptr = puVar35[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01d09187;
            puVar35 = puVar35 + -1;
            auVar41 = pauVar32[-1];
            auVar87 = ZEXT3264(auVar41);
            pauVar32 = pauVar32 + -1;
            uVar39 = vcmpps_avx512vl(auVar41,local_2740,1);
          } while ((char)uVar39 == '\0');
          uVar38 = (undefined4)uVar39;
          if (uVar34 < (uint)POPCOUNT(uVar38)) {
LAB_01d07e1b:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01d09187;
                uVar11 = vcmpps_avx512vl(auVar87._0_32_,local_2740,9);
                if ((char)uVar11 == '\0') goto LAB_01d07ddc;
                local_2af0 = (ulong)((uint)root.ptr & 0xf) - 8;
                bVar26 = ~(byte)local_2bf4;
                lVar36 = (root.ptr & 0xfffffffffffffff0) + 0x50;
                lVar29 = 0;
                goto LAB_01d07fef;
              }
              uVar39 = 8;
              auVar41 = auVar98._0_32_;
              for (lVar29 = 0;
                  (auVar87 = ZEXT3264(auVar41), lVar29 != 4 &&
                  (uVar30 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar29 * 8), uVar30 != 8));
                  lVar29 = lVar29 + 1) {
                uVar38 = *(undefined4 *)(root.ptr + 0x20 + lVar29 * 4);
                auVar67._4_4_ = uVar38;
                auVar67._0_4_ = uVar38;
                auVar67._8_4_ = uVar38;
                auVar67._12_4_ = uVar38;
                auVar67._16_4_ = uVar38;
                auVar67._20_4_ = uVar38;
                auVar67._24_4_ = uVar38;
                auVar67._28_4_ = uVar38;
                auVar22._8_8_ = local_28e0._8_8_;
                auVar22._0_8_ = local_28e0._0_8_;
                auVar22._16_8_ = local_28e0._16_8_;
                auVar22._24_8_ = local_28e0._24_8_;
                auVar23._8_8_ = local_28e0._40_8_;
                auVar23._0_8_ = local_28e0._32_8_;
                auVar23._16_8_ = local_28e0._48_8_;
                auVar23._24_8_ = local_28e0._56_8_;
                auVar24._8_8_ = local_28e0._72_8_;
                auVar24._0_8_ = local_28e0._64_8_;
                auVar24._16_8_ = local_28e0._80_8_;
                auVar24._24_8_ = local_28e0._88_8_;
                auVar42 = vsubps_avx(auVar67,auVar22);
                auVar87._0_4_ = (float)local_2820._0_4_ * auVar42._0_4_;
                auVar87._4_4_ = (float)local_2820._4_4_ * auVar42._4_4_;
                auVar87._8_4_ = fStack_2818 * auVar42._8_4_;
                auVar87._12_4_ = fStack_2814 * auVar42._12_4_;
                auVar87._16_4_ = fStack_2810 * auVar42._16_4_;
                auVar87._20_4_ = fStack_280c * auVar42._20_4_;
                auVar87._28_36_ = auVar80._28_36_;
                auVar87._24_4_ = fStack_2808 * auVar42._24_4_;
                auVar79 = auVar87._0_32_;
                auVar80 = ZEXT3264(auVar79);
                uVar38 = *(undefined4 *)(root.ptr + 0x40 + lVar29 * 4);
                auVar68._4_4_ = uVar38;
                auVar68._0_4_ = uVar38;
                auVar68._8_4_ = uVar38;
                auVar68._12_4_ = uVar38;
                auVar68._16_4_ = uVar38;
                auVar68._20_4_ = uVar38;
                auVar68._24_4_ = uVar38;
                auVar68._28_4_ = uVar38;
                auVar42 = vsubps_avx(auVar68,auVar23);
                auVar84._0_4_ = (float)local_2800._0_4_ * auVar42._0_4_;
                auVar84._4_4_ = (float)local_2800._4_4_ * auVar42._4_4_;
                auVar84._8_4_ = fStack_27f8 * auVar42._8_4_;
                auVar84._12_4_ = fStack_27f4 * auVar42._12_4_;
                auVar84._16_4_ = fStack_27f0 * auVar42._16_4_;
                auVar84._20_4_ = fStack_27ec * auVar42._20_4_;
                auVar84._28_36_ = in_ZMM7._28_36_;
                auVar84._24_4_ = fStack_27e8 * auVar42._24_4_;
                auVar83 = auVar84._0_32_;
                in_ZMM7 = ZEXT3264(auVar83);
                uVar38 = *(undefined4 *)(root.ptr + 0x60 + lVar29 * 4);
                auVar69._4_4_ = uVar38;
                auVar69._0_4_ = uVar38;
                auVar69._8_4_ = uVar38;
                auVar69._12_4_ = uVar38;
                auVar69._16_4_ = uVar38;
                auVar69._20_4_ = uVar38;
                auVar69._24_4_ = uVar38;
                auVar69._28_4_ = uVar38;
                auVar42 = vsubps_avx(auVar69,auVar24);
                auVar85._0_4_ = (float)local_27e0._0_4_ * auVar42._0_4_;
                auVar85._4_4_ = (float)local_27e0._4_4_ * auVar42._4_4_;
                auVar85._8_4_ = fStack_27d8 * auVar42._8_4_;
                auVar85._12_4_ = fStack_27d4 * auVar42._12_4_;
                auVar85._16_4_ = fStack_27d0 * auVar42._16_4_;
                auVar85._20_4_ = fStack_27cc * auVar42._20_4_;
                auVar85._28_36_ = in_ZMM9._28_36_;
                auVar85._24_4_ = fStack_27c8 * auVar42._24_4_;
                auVar73 = auVar85._0_32_;
                in_ZMM9 = ZEXT3264(auVar73);
                uVar38 = *(undefined4 *)(root.ptr + 0x30 + lVar29 * 4);
                auVar70._4_4_ = uVar38;
                auVar70._0_4_ = uVar38;
                auVar70._8_4_ = uVar38;
                auVar70._12_4_ = uVar38;
                auVar70._16_4_ = uVar38;
                auVar70._20_4_ = uVar38;
                auVar70._24_4_ = uVar38;
                auVar70._28_4_ = uVar38;
                auVar42 = vsubps_avx(auVar70,auVar22);
                auVar17._4_4_ = (float)local_2820._4_4_ * auVar42._4_4_;
                auVar17._0_4_ = (float)local_2820._0_4_ * auVar42._0_4_;
                auVar17._8_4_ = fStack_2818 * auVar42._8_4_;
                auVar17._12_4_ = fStack_2814 * auVar42._12_4_;
                auVar17._16_4_ = fStack_2810 * auVar42._16_4_;
                auVar17._20_4_ = fStack_280c * auVar42._20_4_;
                auVar17._24_4_ = fStack_2808 * auVar42._24_4_;
                auVar17._28_4_ = (int)((ulong)local_28e0._24_8_ >> 0x20);
                uVar38 = *(undefined4 *)(root.ptr + 0x50 + lVar29 * 4);
                auVar71._4_4_ = uVar38;
                auVar71._0_4_ = uVar38;
                auVar71._8_4_ = uVar38;
                auVar71._12_4_ = uVar38;
                auVar71._16_4_ = uVar38;
                auVar71._20_4_ = uVar38;
                auVar71._24_4_ = uVar38;
                auVar71._28_4_ = uVar38;
                auVar42 = vsubps_avx(auVar71,auVar23);
                auVar18._4_4_ = (float)local_2800._4_4_ * auVar42._4_4_;
                auVar18._0_4_ = (float)local_2800._0_4_ * auVar42._0_4_;
                auVar18._8_4_ = fStack_27f8 * auVar42._8_4_;
                auVar18._12_4_ = fStack_27f4 * auVar42._12_4_;
                auVar18._16_4_ = fStack_27f0 * auVar42._16_4_;
                auVar18._20_4_ = fStack_27ec * auVar42._20_4_;
                auVar18._24_4_ = fStack_27e8 * auVar42._24_4_;
                auVar18._28_4_ = (int)((ulong)local_28e0._56_8_ >> 0x20);
                uVar38 = *(undefined4 *)(root.ptr + 0x70 + lVar29 * 4);
                auVar72._4_4_ = uVar38;
                auVar72._0_4_ = uVar38;
                auVar72._8_4_ = uVar38;
                auVar72._12_4_ = uVar38;
                auVar72._16_4_ = uVar38;
                auVar72._20_4_ = uVar38;
                auVar72._24_4_ = uVar38;
                auVar72._28_4_ = uVar38;
                auVar42 = vsubps_avx(auVar72,auVar24);
                auVar19._4_4_ = (float)local_27e0._4_4_ * auVar42._4_4_;
                auVar19._0_4_ = (float)local_27e0._0_4_ * auVar42._0_4_;
                auVar19._8_4_ = fStack_27d8 * auVar42._8_4_;
                auVar19._12_4_ = fStack_27d4 * auVar42._12_4_;
                auVar19._16_4_ = fStack_27d0 * auVar42._16_4_;
                auVar19._20_4_ = fStack_27cc * auVar42._20_4_;
                auVar19._24_4_ = fStack_27c8 * auVar42._24_4_;
                auVar19._28_4_ = (int)((ulong)local_28e0._88_8_ >> 0x20);
                auVar42 = vminps_avx(auVar79,auVar17);
                auVar43 = vminps_avx(auVar83,auVar18);
                auVar42 = vmaxps_avx(auVar42,auVar43);
                auVar43 = vminps_avx(auVar73,auVar19);
                auVar42 = vmaxps_avx(auVar42,auVar43);
                auVar44 = vmulps_avx512vl(auVar42,auVar99._0_32_);
                auVar42 = vmaxps_avx(auVar79,auVar17);
                auVar43 = vmaxps_avx(auVar83,auVar18);
                auVar43 = vminps_avx(auVar42,auVar43);
                auVar42 = vmaxps_avx(auVar73,auVar19);
                auVar42 = vminps_avx(auVar43,auVar42);
                auVar43 = vmulps_avx512vl(auVar42,auVar100._0_32_);
                auVar25._4_4_ = uStack_275c;
                auVar25._0_4_ = local_2760;
                auVar25._8_4_ = uStack_2758;
                auVar25._12_4_ = uStack_2754;
                auVar25._16_4_ = uStack_2750;
                auVar25._20_4_ = uStack_274c;
                auVar25._24_4_ = uStack_2748;
                auVar25._28_4_ = uStack_2744;
                auVar42 = vmaxps_avx(auVar44,auVar25);
                auVar43 = vminps_avx(auVar43,local_2740);
                uVar31 = vcmpps_avx512vl(auVar42,auVar43,2);
                uVar33 = uVar39;
                auVar45 = auVar41;
                if ((byte)uVar31 != 0) {
                  auVar42 = vblendmps_avx512vl(auVar98._0_32_,auVar44);
                  bVar27 = (bool)((byte)uVar31 & 1);
                  auVar45._0_4_ = (uint)bVar27 * auVar42._0_4_ | (uint)!bVar27 * auVar44._0_4_;
                  bVar27 = (bool)((byte)(uVar31 >> 1) & 1);
                  auVar45._4_4_ = (uint)bVar27 * auVar42._4_4_ | (uint)!bVar27 * auVar44._4_4_;
                  bVar27 = (bool)((byte)(uVar31 >> 2) & 1);
                  auVar45._8_4_ = (uint)bVar27 * auVar42._8_4_ | (uint)!bVar27 * auVar44._8_4_;
                  bVar27 = (bool)((byte)(uVar31 >> 3) & 1);
                  auVar45._12_4_ = (uint)bVar27 * auVar42._12_4_ | (uint)!bVar27 * auVar44._12_4_;
                  bVar27 = (bool)((byte)(uVar31 >> 4) & 1);
                  auVar45._16_4_ = (uint)bVar27 * auVar42._16_4_ | (uint)!bVar27 * auVar44._16_4_;
                  bVar27 = (bool)((byte)(uVar31 >> 5) & 1);
                  auVar45._20_4_ = (uint)bVar27 * auVar42._20_4_ | (uint)!bVar27 * auVar44._20_4_;
                  bVar27 = (bool)((byte)(uVar31 >> 6) & 1);
                  auVar45._24_4_ = (uint)bVar27 * auVar42._24_4_ | (uint)!bVar27 * auVar44._24_4_;
                  bVar27 = SUB81(uVar31 >> 7,0);
                  auVar45._28_4_ = (uint)bVar27 * auVar42._28_4_ | (uint)!bVar27 * auVar44._28_4_;
                  uVar33 = uVar30;
                  if (uVar39 != 8) {
                    *puVar35 = uVar39;
                    puVar35 = puVar35 + 1;
                    *pauVar32 = auVar41;
                    pauVar32 = pauVar32 + 1;
                  }
                }
                auVar41 = auVar45;
                uVar39 = uVar33;
              }
              if (uVar39 == 8) goto LAB_01d07f99;
              uVar11 = vcmpps_avx512vl(auVar41,local_2740,9);
              root.ptr = uVar39;
            } while ((byte)uVar34 < (byte)POPCOUNT((int)uVar11));
            *puVar35 = uVar39;
            puVar35 = puVar35 + 1;
            *pauVar32 = auVar41;
            pauVar32 = pauVar32 + 1;
LAB_01d07f99:
            iVar28 = 4;
          }
          else {
            while (local_2b80 = auVar41, bVar26 = (byte)local_2bf4, uVar39 != 0) {
              local_2bc8 = 0;
              for (uVar30 = uVar39; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                local_2bc8 = local_2bc8 + 1;
              }
              uVar39 = uVar39 - 1 & uVar39;
              auVar80 = ZEXT1664(auVar80._0_16_);
              in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
              in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
              bVar27 = occluded1(local_2af8,local_2b00,root,local_2bc8,&local_2bc9,ray,
                                 (TravRayK<8,_true> *)&local_28e0.field_0,context);
              bVar37 = (byte)(1 << ((uint)local_2bc8 & 0x1f));
              if (!bVar27) {
                bVar37 = 0;
              }
              local_2bf4 = (uint)(bVar26 | bVar37);
              auVar41 = local_2b80;
            }
            iVar28 = 3;
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar96 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar97 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar98 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar99 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar100 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar101 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar95 = ZEXT3264(auVar41);
            auVar87 = ZEXT3264(local_2b80);
            if (bVar26 != 0xff) {
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_2740._0_4_ =
                   (uint)(bVar26 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar26 & 1) * local_2740._0_4_
              ;
              bVar27 = (bool)((byte)(local_2bf4 >> 1) & 1);
              local_2740._4_4_ = (uint)bVar27 * auVar41._4_4_ | (uint)!bVar27 * local_2740._4_4_;
              bVar27 = (bool)((byte)(local_2bf4 >> 2) & 1);
              local_2740._8_4_ = (uint)bVar27 * auVar41._8_4_ | (uint)!bVar27 * local_2740._8_4_;
              bVar27 = (bool)((byte)(local_2bf4 >> 3) & 1);
              local_2740._12_4_ = (uint)bVar27 * auVar41._12_4_ | (uint)!bVar27 * local_2740._12_4_;
              bVar27 = (bool)((byte)(local_2bf4 >> 4) & 1);
              local_2740._16_4_ = (uint)bVar27 * auVar41._16_4_ | (uint)!bVar27 * local_2740._16_4_;
              bVar27 = (bool)((byte)(local_2bf4 >> 5) & 1);
              local_2740._20_4_ = (uint)bVar27 * auVar41._20_4_ | (uint)!bVar27 * local_2740._20_4_;
              bVar27 = (bool)((byte)(local_2bf4 >> 6) & 1);
              local_2740._24_4_ = (uint)bVar27 * auVar41._24_4_ | (uint)!bVar27 * local_2740._24_4_;
              local_2740._28_4_ =
                   (local_2bf4 >> 7) * auVar41._28_4_ |
                   (uint)!SUB41(local_2bf4 >> 7,0) * local_2740._28_4_;
              iVar28 = 2;
            }
            if (uVar34 < (uint)POPCOUNT(uVar38)) goto LAB_01d07e1b;
          }
        } while (iVar28 != 3);
LAB_01d09187:
        local_2b88._0_1_ = (byte)local_2bf4 & (byte)local_2b88;
        bVar27 = (bool)((byte)local_2b88 >> 1 & 1);
        bVar6 = (bool)((byte)local_2b88 >> 2 & 1);
        bVar7 = (bool)((byte)local_2b88 >> 3 & 1);
        bVar8 = (bool)((byte)local_2b88 >> 4 & 1);
        bVar9 = (bool)((byte)local_2b88 >> 5 & 1);
        bVar10 = (bool)((byte)local_2b88 >> 6 & 1);
        *(uint *)local_2b90 =
             (uint)((byte)local_2b88 & 1) * -0x800000 |
             (uint)!(bool)((byte)local_2b88 & 1) * *(int *)local_2b90;
        *(uint *)(local_2b90 + 4) =
             (uint)bVar27 * -0x800000 | (uint)!bVar27 * *(int *)(local_2b90 + 4);
        *(uint *)(local_2b90 + 8) =
             (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_2b90 + 8);
        *(uint *)(local_2b90 + 0xc) =
             (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_2b90 + 0xc);
        *(uint *)(local_2b90 + 0x10) =
             (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_2b90 + 0x10);
        *(uint *)(local_2b90 + 0x14) =
             (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_2b90 + 0x14);
        *(uint *)(local_2b90 + 0x18) =
             (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(local_2b90 + 0x18);
        *(uint *)(local_2b90 + 0x1c) =
             (uint)((byte)local_2b88 >> 7) * -0x800000 |
             (uint)!(bool)((byte)local_2b88 >> 7) * *(int *)(local_2b90 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_01d07fef:
  do {
    local_2bc8 = -0x10;
    if (lVar29 == local_2af0) goto LAB_01d09034;
    local_2ae8 = context->scene;
    uVar39 = (ulong)bVar26;
    local_2b48 = lVar29;
    do {
      if ((local_2bc8 == 0) || (iVar28 = *(int *)(lVar36 + 0x10 + local_2bc8), iVar28 == -1))
      goto LAB_01d09014;
      uVar30 = CONCAT44(0,*(uint *)(lVar36 + local_2bc8));
      local_2b40._0_8_ = uVar30;
      pfVar2 = (local_2ae8->vertices).items[uVar30];
      uVar31 = (ulong)*(uint *)(lVar36 + -0x40 + local_2bc8);
      local_2b80._0_4_ = (int)uVar39;
      uVar33 = (ulong)*(uint *)(lVar36 + -0x30 + local_2bc8);
      fVar86 = pfVar2[uVar31];
      auVar73._4_4_ = fVar86;
      auVar73._0_4_ = fVar86;
      auVar73._8_4_ = fVar86;
      auVar73._12_4_ = fVar86;
      auVar73._16_4_ = fVar86;
      auVar73._20_4_ = fVar86;
      auVar73._24_4_ = fVar86;
      auVar73._28_4_ = fVar86;
      fVar86 = pfVar2[uVar31 + 1];
      auVar75._4_4_ = fVar86;
      auVar75._0_4_ = fVar86;
      auVar75._8_4_ = fVar86;
      auVar75._12_4_ = fVar86;
      auVar75._16_4_ = fVar86;
      auVar75._20_4_ = fVar86;
      auVar75._24_4_ = fVar86;
      auVar75._28_4_ = fVar86;
      fVar86 = pfVar2[uVar31 + 2];
      auVar76._4_4_ = fVar86;
      auVar76._0_4_ = fVar86;
      auVar76._8_4_ = fVar86;
      auVar76._12_4_ = fVar86;
      auVar76._16_4_ = fVar86;
      auVar76._20_4_ = fVar86;
      auVar76._24_4_ = fVar86;
      auVar76._28_4_ = fVar86;
      fVar86 = pfVar2[uVar33];
      local_2ae0._4_4_ = fVar86;
      local_2ae0._0_4_ = fVar86;
      local_2ae0._8_4_ = fVar86;
      local_2ae0._12_4_ = fVar86;
      local_2ae0._16_4_ = fVar86;
      local_2ae0._20_4_ = fVar86;
      local_2ae0._24_4_ = fVar86;
      local_2ae0._28_4_ = fVar86;
      fVar86 = pfVar2[uVar33 + 1];
      local_2640._4_4_ = fVar86;
      local_2640._0_4_ = fVar86;
      local_2640._8_4_ = fVar86;
      local_2640._12_4_ = fVar86;
      local_2640._16_4_ = fVar86;
      local_2640._20_4_ = fVar86;
      local_2640._24_4_ = fVar86;
      local_2640._28_4_ = fVar86;
      local_2660 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar2[uVar33 + 2]));
      uVar31 = (ulong)*(uint *)(lVar36 + -0x10 + local_2bc8);
      local_2680 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar2[uVar31]));
      local_26a0 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar2[uVar31 + 1]));
      local_26c0 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar2[uVar31 + 2]));
      auVar41 = *(undefined1 (*) [32])ray;
      auVar42 = *(undefined1 (*) [32])(ray + 0x20);
      auVar43 = *(undefined1 (*) [32])(ray + 0x40);
      auVar44 = *(undefined1 (*) [32])(ray + 0x80);
      auVar79 = *(undefined1 (*) [32])(ray + 0xa0);
      in_ZMM7 = ZEXT3264(auVar79);
      auVar83 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar73 = vsubps_avx(auVar73,auVar41);
      auVar75 = vsubps_avx(auVar75,auVar42);
      auVar76 = vsubps_avx(auVar76,auVar43);
      auVar59 = vsubps_avx(local_2ae0,auVar41);
      auVar58 = vsubps_avx(local_2640,auVar42);
      auVar46 = vsubps_avx512vl(local_2660,auVar43);
      auVar47 = vsubps_avx512vl(local_2680,auVar41);
      auVar48 = vsubps_avx512vl(local_26a0,auVar42);
      auVar49 = vsubps_avx512vl(local_26c0,auVar43);
      auVar50 = vsubps_avx512vl(auVar47,auVar73);
      auVar51 = vsubps_avx512vl(auVar48,auVar75);
      auVar52 = vsubps_avx512vl(auVar49,auVar76);
      auVar53 = vsubps_avx512vl(auVar73,auVar59);
      auVar54 = vsubps_avx512vl(auVar75,auVar58);
      auVar55 = vsubps_avx512vl(auVar76,auVar46);
      auVar56 = vaddps_avx512vl(auVar47,auVar73);
      auVar57 = vaddps_avx512vl(auVar48,auVar75);
      auVar43 = vaddps_avx512vl(auVar49,auVar76);
      auVar42._4_4_ = auVar52._4_4_ * auVar57._4_4_;
      auVar42._0_4_ = auVar52._0_4_ * auVar57._0_4_;
      auVar42._8_4_ = auVar52._8_4_ * auVar57._8_4_;
      auVar42._12_4_ = auVar52._12_4_ * auVar57._12_4_;
      auVar42._16_4_ = auVar52._16_4_ * auVar57._16_4_;
      auVar42._20_4_ = auVar52._20_4_ * auVar57._20_4_;
      auVar42._24_4_ = auVar52._24_4_ * auVar57._24_4_;
      auVar42._28_4_ = auVar41._28_4_;
      auVar15 = vfmsub231ps_fma(auVar42,auVar51,auVar43);
      auVar41._4_4_ = auVar50._4_4_ * auVar43._4_4_;
      auVar41._0_4_ = auVar50._0_4_ * auVar43._0_4_;
      auVar41._8_4_ = auVar50._8_4_ * auVar43._8_4_;
      auVar41._12_4_ = auVar50._12_4_ * auVar43._12_4_;
      auVar41._16_4_ = auVar50._16_4_ * auVar43._16_4_;
      auVar41._20_4_ = auVar50._20_4_ * auVar43._20_4_;
      auVar41._24_4_ = auVar50._24_4_ * auVar43._24_4_;
      auVar41._28_4_ = auVar43._28_4_;
      auVar74 = vfmsub231ps_fma(auVar41,auVar52,auVar56);
      auVar43._4_4_ = auVar51._4_4_ * auVar56._4_4_;
      auVar43._0_4_ = auVar51._0_4_ * auVar56._0_4_;
      auVar43._8_4_ = auVar51._8_4_ * auVar56._8_4_;
      auVar43._12_4_ = auVar51._12_4_ * auVar56._12_4_;
      auVar43._16_4_ = auVar51._16_4_ * auVar56._16_4_;
      auVar43._20_4_ = auVar51._20_4_ * auVar56._20_4_;
      auVar43._24_4_ = auVar51._24_4_ * auVar56._24_4_;
      auVar43._28_4_ = auVar56._28_4_;
      auVar78 = vfmsub231ps_fma(auVar43,auVar50,auVar57);
      fVar86 = auVar83._0_4_;
      auVar57._0_4_ = fVar86 * auVar78._0_4_;
      fVar88 = auVar83._4_4_;
      auVar57._4_4_ = fVar88 * auVar78._4_4_;
      fVar89 = auVar83._8_4_;
      auVar57._8_4_ = fVar89 * auVar78._8_4_;
      fVar90 = auVar83._12_4_;
      auVar57._12_4_ = fVar90 * auVar78._12_4_;
      fVar91 = auVar83._16_4_;
      auVar57._16_4_ = fVar91 * 0.0;
      fVar92 = auVar83._20_4_;
      auVar57._20_4_ = fVar92 * 0.0;
      fVar93 = auVar83._24_4_;
      auVar57._24_4_ = fVar93 * 0.0;
      auVar57._28_4_ = 0;
      auVar74 = vfmadd231ps_fma(auVar57,auVar79,ZEXT1632(auVar74));
      auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar44,ZEXT1632(auVar15));
      auVar61._0_4_ = auVar59._0_4_ + auVar73._0_4_;
      auVar61._4_4_ = auVar59._4_4_ + auVar73._4_4_;
      auVar61._8_4_ = auVar59._8_4_ + auVar73._8_4_;
      auVar61._12_4_ = auVar59._12_4_ + auVar73._12_4_;
      auVar61._16_4_ = auVar59._16_4_ + auVar73._16_4_;
      auVar61._20_4_ = auVar59._20_4_ + auVar73._20_4_;
      auVar61._24_4_ = auVar59._24_4_ + auVar73._24_4_;
      auVar61._28_4_ = auVar59._28_4_ + auVar73._28_4_;
      auVar62._0_4_ = auVar58._0_4_ + auVar75._0_4_;
      auVar62._4_4_ = auVar58._4_4_ + auVar75._4_4_;
      auVar62._8_4_ = auVar58._8_4_ + auVar75._8_4_;
      auVar62._12_4_ = auVar58._12_4_ + auVar75._12_4_;
      auVar62._16_4_ = auVar58._16_4_ + auVar75._16_4_;
      auVar62._20_4_ = auVar58._20_4_ + auVar75._20_4_;
      auVar62._24_4_ = auVar58._24_4_ + auVar75._24_4_;
      auVar62._28_4_ = auVar58._28_4_ + auVar75._28_4_;
      auVar41 = vaddps_avx512vl(auVar76,auVar46);
      auVar42 = vmulps_avx512vl(auVar62,auVar55);
      auVar42 = vfmsub231ps_avx512vl(auVar42,auVar54,auVar41);
      auVar41 = vmulps_avx512vl(auVar41,auVar53);
      auVar41 = vfmsub231ps_avx512vl(auVar41,auVar55,auVar61);
      auVar43 = vmulps_avx512vl(auVar61,auVar54);
      auVar43 = vfmsub231ps_avx512vl(auVar43,auVar53,auVar62);
      auVar57 = vsubps_avx512vl(auVar59,auVar47);
      auVar56._4_4_ = fVar88 * auVar43._4_4_;
      auVar56._0_4_ = fVar86 * auVar43._0_4_;
      auVar56._8_4_ = fVar89 * auVar43._8_4_;
      auVar56._12_4_ = fVar90 * auVar43._12_4_;
      auVar56._16_4_ = fVar91 * auVar43._16_4_;
      auVar56._20_4_ = fVar92 * auVar43._20_4_;
      auVar56._24_4_ = fVar93 * auVar43._24_4_;
      auVar56._28_4_ = auVar43._28_4_;
      auVar41 = vfmadd231ps_avx512vl(auVar56,auVar79,auVar41);
      auVar43 = vsubps_avx512vl(auVar58,auVar48);
      auVar15 = vfmadd231ps_fma(auVar41,auVar44,auVar42);
      auVar80 = ZEXT1664(auVar15);
      auVar41 = vsubps_avx512vl(auVar46,auVar49);
      in_ZMM9 = ZEXT3264(auVar41);
      auVar42 = vaddps_avx512vl(auVar59,auVar47);
      auVar58 = vaddps_avx512vl(auVar58,auVar48);
      auVar59 = vaddps_avx512vl(auVar46,auVar49);
      auVar56 = vmulps_avx512vl(auVar58,auVar41);
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar43,auVar59);
      auVar59 = vmulps_avx512vl(auVar59,auVar57);
      auVar46 = vfmsub231ps_avx512vl(auVar59,auVar41,auVar42);
      auVar59._4_4_ = auVar42._4_4_ * auVar43._4_4_;
      auVar59._0_4_ = auVar42._0_4_ * auVar43._0_4_;
      auVar59._8_4_ = auVar42._8_4_ * auVar43._8_4_;
      auVar59._12_4_ = auVar42._12_4_ * auVar43._12_4_;
      auVar59._16_4_ = auVar42._16_4_ * auVar43._16_4_;
      auVar59._20_4_ = auVar42._20_4_ * auVar43._20_4_;
      auVar59._24_4_ = auVar42._24_4_ * auVar43._24_4_;
      auVar59._28_4_ = auVar42._28_4_;
      auVar78 = vfmsub231ps_fma(auVar59,auVar57,auVar58);
      auVar42 = vmulps_avx512vl(ZEXT1632(auVar78),auVar83);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar79,auVar46);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar44,auVar56);
      auVar59 = vaddps_avx512vl(auVar42,ZEXT1632(CONCAT412(auVar74._12_4_ + auVar15._12_4_,
                                                           CONCAT48(auVar74._8_4_ + auVar15._8_4_,
                                                                    CONCAT44(auVar74._4_4_ +
                                                                             auVar15._4_4_,
                                                                             auVar74._0_4_ +
                                                                             auVar15._0_4_)))));
      auVar47 = auVar96._0_32_;
      vandps_avx512vl(auVar59,auVar47);
      auVar58 = vmulps_avx512vl(auVar59,auVar101._0_32_);
      auVar56 = vminps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar15));
      auVar56 = vminps_avx512vl(auVar56,auVar42);
      auVar46 = vxorps_avx512vl(auVar58,auVar95._0_32_);
      uVar11 = vcmpps_avx512vl(auVar56,auVar46,5);
      uVar31 = (ulong)*(uint *)(lVar36 + -0x20 + local_2bc8);
      auVar56 = vmaxps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar15));
      auVar42 = vmaxps_avx512vl(auVar56,auVar42);
      local_26e0 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar2[uVar31]));
      uVar12 = vcmpps_avx512vl(auVar42,auVar58,2);
      local_2700 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar2[uVar31 + 1]));
      local_2720 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar2[uVar31 + 2]));
      bVar37 = ((byte)uVar11 | (byte)uVar12) & (byte)uVar39;
      if (bVar37 != 0) {
        auVar42 = vmulps_avx512vl(auVar54,auVar52);
        auVar58 = vmulps_avx512vl(auVar50,auVar55);
        auVar56 = vmulps_avx512vl(auVar53,auVar51);
        auVar46 = vmulps_avx512vl(auVar43,auVar55);
        auVar48 = vmulps_avx512vl(auVar53,auVar41);
        auVar49 = vmulps_avx512vl(auVar57,auVar54);
        auVar51 = vfmsub213ps_avx512vl(auVar51,auVar55,auVar42);
        auVar52 = vfmsub213ps_avx512vl(auVar52,auVar53,auVar58);
        auVar50 = vfmsub213ps_avx512vl(auVar50,auVar54,auVar56);
        auVar41 = vfmsub213ps_avx512vl(auVar41,auVar54,auVar46);
        auVar54 = vfmsub213ps_avx512vl(auVar57,auVar55,auVar48);
        auVar43 = vfmsub213ps_avx512vl(auVar43,auVar53,auVar49);
        vandps_avx512vl(auVar42,auVar47);
        vandps_avx512vl(auVar46,auVar47);
        uVar31 = vcmpps_avx512vl(auVar43,auVar43,1);
        vandps_avx512vl(auVar58,auVar47);
        vandps_avx512vl(auVar48,auVar47);
        uVar33 = vcmpps_avx512vl(auVar43,auVar43,1);
        vandps_avx512vl(auVar56,auVar47);
        vandps_avx512vl(auVar49,auVar47);
        uVar13 = vcmpps_avx512vl(auVar43,auVar43,1);
        bVar27 = (bool)((byte)uVar31 & 1);
        auVar40._0_4_ = (uint)bVar27 * auVar51._0_4_ | (uint)!bVar27 * auVar41._0_4_;
        bVar27 = (bool)((byte)(uVar31 >> 1) & 1);
        auVar40._4_4_ = (uint)bVar27 * auVar51._4_4_ | (uint)!bVar27 * auVar41._4_4_;
        bVar27 = (bool)((byte)(uVar31 >> 2) & 1);
        auVar40._8_4_ = (uint)bVar27 * auVar51._8_4_ | (uint)!bVar27 * auVar41._8_4_;
        bVar27 = (bool)((byte)(uVar31 >> 3) & 1);
        auVar40._12_4_ = (uint)bVar27 * auVar51._12_4_ | (uint)!bVar27 * auVar41._12_4_;
        bVar27 = (bool)((byte)(uVar31 >> 4) & 1);
        local_2a60._16_4_ = (uint)bVar27 * auVar51._16_4_ | (uint)!bVar27 * auVar41._16_4_;
        local_2a60._0_16_ = auVar40;
        bVar27 = (bool)((byte)(uVar31 >> 5) & 1);
        local_2a60._20_4_ = (uint)bVar27 * auVar51._20_4_ | (uint)!bVar27 * auVar41._20_4_;
        bVar27 = (bool)((byte)(uVar31 >> 6) & 1);
        local_2a60._24_4_ = (uint)bVar27 * auVar51._24_4_ | (uint)!bVar27 * auVar41._24_4_;
        bVar27 = SUB81(uVar31 >> 7,0);
        local_2a60._28_4_ = (uint)bVar27 * auVar51._28_4_ | (uint)!bVar27 * auVar41._28_4_;
        in_ZMM9 = ZEXT3264((undefined1  [32])local_2a60.field_0.x.field_0);
        bVar27 = (bool)((byte)uVar33 & 1);
        vVar60.field_0._0_4_ = (uint)bVar27 * auVar52._0_4_ | (uint)!bVar27 * auVar54._0_4_;
        bVar27 = (bool)((byte)(uVar33 >> 1) & 1);
        vVar60.field_0._4_4_ = (uint)bVar27 * auVar52._4_4_ | (uint)!bVar27 * auVar54._4_4_;
        bVar27 = (bool)((byte)(uVar33 >> 2) & 1);
        vVar60.field_0._8_4_ = (uint)bVar27 * auVar52._8_4_ | (uint)!bVar27 * auVar54._8_4_;
        bVar27 = (bool)((byte)(uVar33 >> 3) & 1);
        vVar60.field_0._12_4_ = (uint)bVar27 * auVar52._12_4_ | (uint)!bVar27 * auVar54._12_4_;
        bVar27 = (bool)((byte)(uVar33 >> 4) & 1);
        vVar60.field_0._16_4_ = (uint)bVar27 * auVar52._16_4_ | (uint)!bVar27 * auVar54._16_4_;
        bVar27 = (bool)((byte)(uVar33 >> 5) & 1);
        vVar60.field_0._20_4_ = (uint)bVar27 * auVar52._20_4_ | (uint)!bVar27 * auVar54._20_4_;
        bVar27 = (bool)((byte)(uVar33 >> 6) & 1);
        vVar60.field_0._24_4_ = (uint)bVar27 * auVar52._24_4_ | (uint)!bVar27 * auVar54._24_4_;
        bVar27 = SUB81(uVar33 >> 7,0);
        vVar60.field_0._28_4_ = (uint)bVar27 * auVar52._28_4_ | (uint)!bVar27 * auVar54._28_4_;
        bVar27 = (bool)((byte)uVar13 & 1);
        local_2a60._64_4_ = (float)((uint)bVar27 * auVar50._0_4_ | (uint)!bVar27 * auVar43._0_4_);
        bVar27 = (bool)((byte)(uVar13 >> 1) & 1);
        local_2a60._68_4_ = (float)((uint)bVar27 * auVar50._4_4_ | (uint)!bVar27 * auVar43._4_4_);
        bVar27 = (bool)((byte)(uVar13 >> 2) & 1);
        local_2a60._72_4_ = (float)((uint)bVar27 * auVar50._8_4_ | (uint)!bVar27 * auVar43._8_4_);
        bVar27 = (bool)((byte)(uVar13 >> 3) & 1);
        local_2a60._76_4_ = (float)((uint)bVar27 * auVar50._12_4_ | (uint)!bVar27 * auVar43._12_4_);
        bVar27 = (bool)((byte)(uVar13 >> 4) & 1);
        local_2a60._80_4_ = (float)((uint)bVar27 * auVar50._16_4_ | (uint)!bVar27 * auVar43._16_4_);
        bVar27 = (bool)((byte)(uVar13 >> 5) & 1);
        local_2a60._84_4_ = (float)((uint)bVar27 * auVar50._20_4_ | (uint)!bVar27 * auVar43._20_4_);
        bVar27 = (bool)((byte)(uVar13 >> 6) & 1);
        local_2a60._88_4_ = (float)((uint)bVar27 * auVar50._24_4_ | (uint)!bVar27 * auVar43._24_4_);
        bVar27 = SUB81(uVar13 >> 7,0);
        local_2a60._92_4_ = (uint)bVar27 * auVar50._28_4_ | (uint)!bVar27 * auVar43._28_4_;
        auVar58._4_4_ = fVar88 * local_2a60._68_4_;
        auVar58._0_4_ = fVar86 * local_2a60._64_4_;
        auVar58._8_4_ = fVar89 * local_2a60._72_4_;
        auVar58._12_4_ = fVar90 * local_2a60._76_4_;
        auVar58._16_4_ = fVar91 * local_2a60._80_4_;
        auVar58._20_4_ = fVar92 * local_2a60._84_4_;
        auVar58._24_4_ = fVar93 * local_2a60._88_4_;
        auVar58._28_4_ = auVar83._28_4_;
        auVar78 = vfmadd213ps_fma(auVar79,(undefined1  [32])vVar60.field_0,auVar58);
        auVar78 = vfmadd213ps_fma(auVar44,(undefined1  [32])local_2a60.field_0.x.field_0,
                                  ZEXT1632(auVar78));
        auVar44 = ZEXT1632(CONCAT412(auVar78._12_4_ + auVar78._12_4_,
                                     CONCAT48(auVar78._8_4_ + auVar78._8_4_,
                                              CONCAT44(auVar78._4_4_ + auVar78._4_4_,
                                                       auVar78._0_4_ + auVar78._0_4_))));
        auVar83._0_4_ = auVar76._0_4_ * local_2a60._64_4_;
        auVar83._4_4_ = auVar76._4_4_ * local_2a60._68_4_;
        auVar83._8_4_ = auVar76._8_4_ * local_2a60._72_4_;
        auVar83._12_4_ = auVar76._12_4_ * local_2a60._76_4_;
        auVar83._16_4_ = auVar76._16_4_ * local_2a60._80_4_;
        auVar83._20_4_ = auVar76._20_4_ * local_2a60._84_4_;
        auVar83._24_4_ = auVar76._24_4_ * local_2a60._88_4_;
        auVar83._28_4_ = 0;
        auVar78 = vfmadd213ps_fma(auVar75,(undefined1  [32])vVar60.field_0,auVar83);
        auVar82 = vfmadd213ps_fma(auVar73,(undefined1  [32])local_2a60.field_0.x.field_0,
                                  ZEXT1632(auVar78));
        auVar41 = vrcp14ps_avx512vl(auVar44);
        auVar42 = vxorps_avx512vl(auVar44,auVar95._0_32_);
        in_ZMM7 = ZEXT3264(auVar42);
        auVar79 = auVar97._0_32_;
        auVar43 = vfnmadd213ps_avx512vl(auVar41,auVar44,auVar79);
        auVar78 = vfmadd132ps_fma(auVar43,auVar41,auVar41);
        local_2a00 = ZEXT1632(CONCAT412(auVar78._12_4_ * (auVar82._12_4_ + auVar82._12_4_),
                                        CONCAT48(auVar78._8_4_ * (auVar82._8_4_ + auVar82._8_4_),
                                                 CONCAT44(auVar78._4_4_ *
                                                          (auVar82._4_4_ + auVar82._4_4_),
                                                          auVar78._0_4_ *
                                                          (auVar82._0_4_ + auVar82._0_4_)))));
        uVar11 = vcmpps_avx512vl(local_2a00,*(undefined1 (*) [32])(ray + 0x100),2);
        uVar12 = vcmpps_avx512vl(local_2a00,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar14 = vcmpps_avx512vl(auVar44,auVar42,4);
        bVar37 = bVar37 & (byte)uVar11 & (byte)uVar12 & (byte)uVar14;
        if (bVar37 != 0) {
          pGVar3 = (context->scene->geometries).items[uVar30].ptr;
          uVar1 = pGVar3->mask;
          auVar44._4_4_ = uVar1;
          auVar44._0_4_ = uVar1;
          auVar44._8_4_ = uVar1;
          auVar44._12_4_ = uVar1;
          auVar44._16_4_ = uVar1;
          auVar44._20_4_ = uVar1;
          auVar44._24_4_ = uVar1;
          auVar44._28_4_ = uVar1;
          uVar11 = vptestmd_avx512vl(auVar44,*(undefined1 (*) [32])(ray + 0x120));
          bVar37 = bVar37 & (byte)uVar11;
          local_2b84 = iVar28;
          if (bVar37 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar46._8_4_ = 0x219392ef;
              auVar46._0_8_ = 0x219392ef219392ef;
              auVar46._12_4_ = 0x219392ef;
              auVar46._16_4_ = 0x219392ef;
              auVar46._20_4_ = 0x219392ef;
              auVar46._24_4_ = 0x219392ef;
              auVar46._28_4_ = 0x219392ef;
              uVar39 = vcmpps_avx512vl(auVar59,auVar46,5);
              auVar41 = vrcp14ps_avx512vl(auVar59);
              auVar43 = vfnmadd213ps_avx512vl(auVar59,auVar41,auVar79);
              auVar43 = vfmadd132ps_avx512vl(auVar43,auVar41,auVar41);
              fVar88 = (float)((uint)((byte)uVar39 & 1) * auVar43._0_4_);
              fVar86 = (float)((uint)((byte)(uVar39 >> 1) & 1) * auVar43._4_4_);
              fVar89 = (float)((uint)((byte)(uVar39 >> 2) & 1) * auVar43._8_4_);
              fVar90 = (float)((uint)((byte)(uVar39 >> 3) & 1) * auVar43._12_4_);
              fVar91 = (float)((uint)((byte)(uVar39 >> 4) & 1) * auVar43._16_4_);
              fVar92 = (float)((uint)((byte)(uVar39 >> 5) & 1) * auVar43._20_4_);
              fVar93 = (float)((uint)((byte)(uVar39 >> 6) & 1) * auVar43._24_4_);
              auVar48._0_4_ = fVar88 * auVar74._0_4_;
              auVar48._4_4_ = fVar86 * auVar74._4_4_;
              auVar48._8_4_ = fVar89 * auVar74._8_4_;
              auVar48._12_4_ = fVar90 * auVar74._12_4_;
              auVar48._16_4_ = fVar91 * 0.0;
              auVar48._20_4_ = fVar92 * 0.0;
              auVar48._24_4_ = fVar93 * 0.0;
              auVar48._28_4_ = 0;
              local_29c0 = vminps_avx512vl(auVar48,auVar79);
              auVar47._4_4_ = fVar86 * auVar15._4_4_;
              auVar47._0_4_ = fVar88 * auVar15._0_4_;
              auVar47._8_4_ = fVar89 * auVar15._8_4_;
              auVar47._12_4_ = fVar90 * auVar15._12_4_;
              auVar47._16_4_ = fVar91 * 0.0;
              auVar47._20_4_ = fVar92 * 0.0;
              auVar47._24_4_ = fVar93 * 0.0;
              auVar47._28_4_ = auVar41._28_4_;
              local_29e0 = vminps_avx512vl(auVar47,auVar79);
              local_2bc0.valid = local_2940;
              local_2bc0.geometryUserPtr = &local_2ac0;
              local_2bc0.context = local_2aa0;
              local_2bc0.ray = local_2a80;
              auVar80 = ZEXT1664(auVar15);
              in_ZMM7 = ZEXT1664(auVar42._0_16_);
              in_ZMM9 = ZEXT1664(auVar40);
              local_2a60.field_0.y.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar60.field_0;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
              ::
              _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                          *)&local_2bc0,
                         (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                          *)&local_2a60.field_0);
              pRVar4 = context->user;
              local_29a0 = vpbroadcastd_avx512vl();
              local_29c0 = vpbroadcastd_avx512vl();
              local_2a60.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_2920;
              auVar41 = vpcmpeqd_avx2(local_29a0,local_29a0);
              local_2b50[1] = auVar41;
              *local_2b50 = auVar41;
              local_2980 = pRVar4->instID[0];
              local_2960 = pRVar4->instPrimID[0];
              local_2b40 = *(undefined1 (*) [32])(ray + 0x100);
              auVar41 = vblendmps_avx512vl(local_2b40,(undefined1  [32])local_2ac0);
              bVar27 = (bool)(bVar37 >> 1 & 1);
              bVar6 = (bool)(bVar37 >> 2 & 1);
              bVar7 = (bool)(bVar37 >> 3 & 1);
              bVar8 = (bool)(bVar37 >> 4 & 1);
              bVar9 = (bool)(bVar37 >> 5 & 1);
              bVar10 = (bool)(bVar37 >> 6 & 1);
              *(uint *)(ray + 0x100) =
                   (uint)(bVar37 & 1) * auVar41._0_4_ | !(bool)(bVar37 & 1) * local_2960;
              *(uint *)(ray + 0x104) = (uint)bVar27 * auVar41._4_4_ | !bVar27 * local_2960;
              *(uint *)(ray + 0x108) = (uint)bVar6 * auVar41._8_4_ | !bVar6 * local_2960;
              *(uint *)(ray + 0x10c) = (uint)bVar7 * auVar41._12_4_ | !bVar7 * local_2960;
              *(uint *)(ray + 0x110) = (uint)bVar8 * auVar41._16_4_ | !bVar8 * local_2960;
              *(uint *)(ray + 0x114) = (uint)bVar9 * auVar41._20_4_ | !bVar9 * local_2960;
              *(uint *)(ray + 0x118) = (uint)bVar10 * auVar41._24_4_ | !bVar10 * local_2960;
              *(uint *)(ray + 0x11c) =
                   (uint)(bVar37 >> 7) * auVar41._28_4_ | !(bool)(bVar37 >> 7) * local_2960;
              local_2b20 = vpmovm2d_avx512vl((ulong)bVar37);
              local_2bc0.valid = (int *)local_2b20;
              local_2bc0.geometryUserPtr = pGVar3->userPtr;
              local_2bc0.context = context->user;
              local_2bc0.hit = (RTCHitN *)&local_2a60;
              local_2bc0.N = 8;
              local_2bc0.ray = (RTCRayN *)ray;
              uStack_297c = local_2980;
              uStack_2978 = local_2980;
              uStack_2974 = local_2980;
              uStack_2970 = local_2980;
              uStack_296c = local_2980;
              uStack_2968 = local_2980;
              uStack_2964 = local_2980;
              uStack_295c = local_2960;
              uStack_2958 = local_2960;
              uStack_2954 = local_2960;
              uStack_2950 = local_2960;
              uStack_294c = local_2960;
              uStack_2948 = local_2960;
              uStack_2944 = local_2960;
              if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar80 = ZEXT1664(auVar80._0_16_);
                in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                (*pGVar3->occlusionFilterN)(&local_2bc0);
              }
              if (local_2b20 == (undefined1  [32])0x0) {
                uVar30 = 0;
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar96 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar97 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar98 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar99 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar100 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar101 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar95 = ZEXT3264(auVar41);
                uVar39 = (ulong)(uint)local_2b80._0_4_;
              }
              else {
                p_Var5 = context->args->filter;
                if (p_Var5 == (RTCFilterFunctionN)0x0) {
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar96 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar97 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar98 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar99 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar100 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar101 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar95 = ZEXT3264(auVar41);
                  uVar39 = (ulong)(uint)local_2b80._0_4_;
                }
                else {
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar96 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar97 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar98 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar99 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar100 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar101 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar95 = ZEXT3264(auVar41);
                  uVar39 = (ulong)(uint)local_2b80._0_4_;
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar3->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    auVar80 = ZEXT1664(auVar80._0_16_);
                    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                    in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                    (*p_Var5)(&local_2bc0);
                    uVar39 = (ulong)(uint)local_2b80._0_4_;
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar95 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                    auVar101 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar100 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar99 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar98 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar97 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar96 = ZEXT3264(auVar41);
                  }
                }
                uVar30 = vptestmd_avx512vl(local_2b20,local_2b20);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar27 = (bool)((byte)uVar30 & 1);
                auVar49._0_4_ =
                     (uint)bVar27 * auVar41._0_4_ | (uint)!bVar27 * *(int *)(local_2bc0.ray + 0x100)
                ;
                bVar27 = (bool)((byte)(uVar30 >> 1) & 1);
                auVar49._4_4_ =
                     (uint)bVar27 * auVar41._4_4_ |
                     (uint)!bVar27 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 4);
                bVar27 = (bool)((byte)(uVar30 >> 2) & 1);
                auVar49._8_4_ =
                     (uint)bVar27 * auVar41._8_4_ |
                     (uint)!bVar27 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 8);
                bVar27 = (bool)((byte)(uVar30 >> 3) & 1);
                auVar49._12_4_ =
                     (uint)bVar27 * auVar41._12_4_ |
                     (uint)!bVar27 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0xc);
                bVar27 = (bool)((byte)(uVar30 >> 4) & 1);
                auVar49._16_4_ =
                     (uint)bVar27 * auVar41._16_4_ |
                     (uint)!bVar27 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x10);
                bVar27 = (bool)((byte)(uVar30 >> 5) & 1);
                auVar49._20_4_ =
                     (uint)bVar27 * auVar41._20_4_ |
                     (uint)!bVar27 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x14);
                bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
                auVar49._24_4_ =
                     (uint)bVar27 * auVar41._24_4_ |
                     (uint)!bVar27 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x18);
                bVar27 = SUB81(uVar30 >> 7,0);
                auVar49._28_4_ =
                     (uint)bVar27 * auVar41._28_4_ |
                     (uint)!bVar27 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x1c);
                *(undefined1 (*) [32])(local_2bc0.ray + 0x100) = auVar49;
              }
              bVar37 = (byte)uVar30;
              auVar50._0_4_ =
                   (uint)(bVar37 & 1) * *(int *)local_2b90 |
                   (uint)!(bool)(bVar37 & 1) * local_2b40._0_4_;
              bVar27 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar50._4_4_ =
                   (uint)bVar27 * *(int *)(local_2b90 + 4) | (uint)!bVar27 * local_2b40._4_4_;
              bVar27 = (bool)((byte)(uVar30 >> 2) & 1);
              auVar50._8_4_ =
                   (uint)bVar27 * *(int *)(local_2b90 + 8) | (uint)!bVar27 * local_2b40._8_4_;
              bVar27 = (bool)((byte)(uVar30 >> 3) & 1);
              auVar50._12_4_ =
                   (uint)bVar27 * *(int *)(local_2b90 + 0xc) | (uint)!bVar27 * local_2b40._12_4_;
              bVar27 = (bool)((byte)(uVar30 >> 4) & 1);
              auVar50._16_4_ =
                   (uint)bVar27 * *(int *)(local_2b90 + 0x10) | (uint)!bVar27 * local_2b40._16_4_;
              bVar27 = (bool)((byte)(uVar30 >> 5) & 1);
              auVar50._20_4_ =
                   (uint)bVar27 * *(int *)(local_2b90 + 0x14) | (uint)!bVar27 * local_2b40._20_4_;
              bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
              auVar50._24_4_ =
                   (uint)bVar27 * *(int *)(local_2b90 + 0x18) | (uint)!bVar27 * local_2b40._24_4_;
              bVar27 = (bool)((byte)(uVar30 >> 7) & 1);
              auVar50._28_4_ =
                   (uint)bVar27 * *(int *)(local_2b90 + 0x1c) | (uint)!bVar27 * local_2b40._28_4_;
              *(undefined1 (*) [32])local_2b90 = auVar50;
            }
            uVar39 = CONCAT71((int7)(uVar39 >> 8),(byte)uVar39 & ~bVar37);
          }
        }
      }
      if ((byte)uVar39 == 0) {
        uVar39 = 0;
        goto LAB_01d09014;
      }
      auVar41 = *(undefined1 (*) [32])ray;
      auVar42 = *(undefined1 (*) [32])(ray + 0x20);
      auVar43 = *(undefined1 (*) [32])(ray + 0x40);
      auVar44 = *(undefined1 (*) [32])(ray + 0x80);
      in_ZMM7 = ZEXT3264(auVar44);
      auVar79 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar83 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar73 = vsubps_avx(local_26e0,auVar41);
      auVar80 = ZEXT3264(auVar73);
      auVar75 = vsubps_avx(local_2700,auVar42);
      auVar76 = vsubps_avx(local_2720,auVar43);
      in_ZMM9 = ZEXT3264(auVar76);
      auVar59 = vsubps_avx(local_2680,auVar41);
      auVar58 = vsubps_avx(local_26a0,auVar42);
      auVar56 = vsubps_avx512vl(local_26c0,auVar43);
      auVar41 = vsubps_avx512vl(local_2ae0,auVar41);
      auVar42 = vsubps_avx512vl(local_2640,auVar42);
      auVar43 = vsubps_avx512vl(local_2660,auVar43);
      auVar46 = vsubps_avx512vl(auVar41,auVar73);
      auVar47 = vsubps_avx512vl(auVar42,auVar75);
      auVar48 = vsubps_avx512vl(auVar43,auVar76);
      auVar49 = vsubps_avx512vl(auVar73,auVar59);
      auVar50 = vsubps_avx512vl(auVar75,auVar58);
      auVar54 = vsubps_avx512vl(auVar76,auVar56);
      auVar55 = vsubps_avx512vl(auVar59,auVar41);
      auVar57 = vsubps_avx512vl(auVar58,auVar42);
      auVar61 = vsubps_avx512vl(auVar56,auVar43);
      auVar52 = vaddps_avx512vl(auVar41,auVar73);
      auVar53 = vaddps_avx512vl(auVar42,auVar75);
      auVar51 = vaddps_avx512vl(auVar43,auVar76);
      auVar62 = vmulps_avx512vl(auVar53,auVar48);
      auVar62 = vfmsub231ps_avx512vl(auVar62,auVar47,auVar51);
      auVar51 = vmulps_avx512vl(auVar51,auVar46);
      auVar63 = vfmsub231ps_avx512vl(auVar51,auVar48,auVar52);
      auVar51._4_4_ = auVar47._4_4_ * auVar52._4_4_;
      auVar51._0_4_ = auVar47._0_4_ * auVar52._0_4_;
      auVar51._8_4_ = auVar47._8_4_ * auVar52._8_4_;
      auVar51._12_4_ = auVar47._12_4_ * auVar52._12_4_;
      auVar51._16_4_ = auVar47._16_4_ * auVar52._16_4_;
      auVar51._20_4_ = auVar47._20_4_ * auVar52._20_4_;
      auVar51._24_4_ = auVar47._24_4_ * auVar52._24_4_;
      auVar51._28_4_ = auVar52._28_4_;
      auVar74 = vfmsub231ps_fma(auVar51,auVar46,auVar53);
      fVar86 = auVar83._0_4_;
      auVar77._0_4_ = fVar86 * auVar74._0_4_;
      fVar88 = auVar83._4_4_;
      auVar77._4_4_ = fVar88 * auVar74._4_4_;
      fVar89 = auVar83._8_4_;
      auVar77._8_4_ = fVar89 * auVar74._8_4_;
      fVar90 = auVar83._12_4_;
      auVar77._12_4_ = fVar90 * auVar74._12_4_;
      fVar91 = auVar83._16_4_;
      auVar77._16_4_ = fVar91 * 0.0;
      fVar92 = auVar83._20_4_;
      auVar77._20_4_ = fVar92 * 0.0;
      fVar93 = auVar83._24_4_;
      auVar77._24_4_ = fVar93 * 0.0;
      auVar77._28_4_ = 0;
      auVar51 = vfmadd231ps_avx512vl(auVar77,auVar79,auVar63);
      auVar51 = vfmadd231ps_avx512vl(auVar51,auVar44,auVar62);
      auVar63._0_4_ = auVar59._0_4_ + auVar73._0_4_;
      auVar63._4_4_ = auVar59._4_4_ + auVar73._4_4_;
      auVar63._8_4_ = auVar59._8_4_ + auVar73._8_4_;
      auVar63._12_4_ = auVar59._12_4_ + auVar73._12_4_;
      auVar63._16_4_ = auVar59._16_4_ + auVar73._16_4_;
      auVar63._20_4_ = auVar59._20_4_ + auVar73._20_4_;
      auVar63._24_4_ = auVar59._24_4_ + auVar73._24_4_;
      auVar63._28_4_ = auVar59._28_4_ + auVar73._28_4_;
      auVar52 = vaddps_avx512vl(auVar75,auVar58);
      auVar53 = vaddps_avx512vl(auVar76,auVar56);
      auVar62 = vmulps_avx512vl(auVar52,auVar54);
      auVar62 = vfmsub231ps_avx512vl(auVar62,auVar50,auVar53);
      auVar53 = vmulps_avx512vl(auVar53,auVar49);
      auVar53 = vfmsub231ps_avx512vl(auVar53,auVar54,auVar63);
      auVar63 = vmulps_avx512vl(auVar63,auVar50);
      auVar63 = vfmsub231ps_avx512vl(auVar63,auVar49,auVar52);
      auVar52._4_4_ = fVar88 * auVar63._4_4_;
      auVar52._0_4_ = fVar86 * auVar63._0_4_;
      auVar52._8_4_ = fVar89 * auVar63._8_4_;
      auVar52._12_4_ = fVar90 * auVar63._12_4_;
      auVar52._16_4_ = fVar91 * auVar63._16_4_;
      auVar52._20_4_ = fVar92 * auVar63._20_4_;
      auVar52._24_4_ = fVar93 * auVar63._24_4_;
      auVar52._28_4_ = auVar63._28_4_;
      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar79,auVar53);
      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar44,auVar62);
      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar95 = ZEXT3264(auVar62);
      auVar41 = vaddps_avx512vl(auVar59,auVar41);
      auVar42 = vaddps_avx512vl(auVar58,auVar42);
      auVar43 = vaddps_avx512vl(auVar56,auVar43);
      auVar59 = vmulps_avx512vl(auVar42,auVar61);
      auVar59 = vfmsub231ps_avx512vl(auVar59,auVar57,auVar43);
      auVar43 = vmulps_avx512vl(auVar43,auVar55);
      auVar43 = vfmsub231ps_avx512vl(auVar43,auVar61,auVar41);
      auVar53._4_4_ = auVar41._4_4_ * auVar57._4_4_;
      auVar53._0_4_ = auVar41._0_4_ * auVar57._0_4_;
      auVar53._8_4_ = auVar41._8_4_ * auVar57._8_4_;
      auVar53._12_4_ = auVar41._12_4_ * auVar57._12_4_;
      auVar53._16_4_ = auVar41._16_4_ * auVar57._16_4_;
      auVar53._20_4_ = auVar41._20_4_ * auVar57._20_4_;
      auVar53._24_4_ = auVar41._24_4_ * auVar57._24_4_;
      auVar53._28_4_ = auVar41._28_4_;
      auVar74 = vfmsub231ps_fma(auVar53,auVar55,auVar42);
      auVar41 = vmulps_avx512vl(ZEXT1632(auVar74),auVar83);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar79,auVar43);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar44,auVar59);
      auVar94._0_4_ = auVar51._0_4_ + auVar52._0_4_;
      auVar94._4_4_ = auVar51._4_4_ + auVar52._4_4_;
      auVar94._8_4_ = auVar51._8_4_ + auVar52._8_4_;
      auVar94._12_4_ = auVar51._12_4_ + auVar52._12_4_;
      auVar94._16_4_ = auVar51._16_4_ + auVar52._16_4_;
      auVar94._20_4_ = auVar51._20_4_ + auVar52._20_4_;
      auVar94._24_4_ = auVar51._24_4_ + auVar52._24_4_;
      auVar94._28_4_ = auVar51._28_4_ + auVar52._28_4_;
      auVar42 = vaddps_avx512vl(auVar41,auVar94);
      auVar56 = auVar96._0_32_;
      vandps_avx512vl(auVar42,auVar56);
      auVar43 = vmulps_avx512vl(auVar42,auVar101._0_32_);
      auVar59 = vminps_avx512vl(auVar51,auVar52);
      auVar59 = vminps_avx512vl(auVar59,auVar41);
      auVar58 = vxorps_avx512vl(auVar43,auVar62);
      uVar11 = vcmpps_avx512vl(auVar59,auVar58,5);
      auVar59 = vmaxps_avx512vl(auVar51,auVar52);
      auVar41 = vmaxps_avx512vl(auVar59,auVar41);
      uVar12 = vcmpps_avx512vl(auVar41,auVar43,2);
      bVar37 = ((byte)uVar11 | (byte)uVar12) & (byte)uVar39;
      if (bVar37 != 0) {
        auVar41 = vmulps_avx512vl(auVar50,auVar48);
        auVar43 = vmulps_avx512vl(auVar46,auVar54);
        auVar59 = vmulps_avx512vl(auVar49,auVar47);
        auVar58 = vmulps_avx512vl(auVar57,auVar54);
        auVar53 = vmulps_avx512vl(auVar49,auVar61);
        auVar63 = vmulps_avx512vl(auVar55,auVar50);
        auVar47 = vfmsub213ps_avx512vl(auVar47,auVar54,auVar41);
        auVar48 = vfmsub213ps_avx512vl(auVar48,auVar49,auVar43);
        auVar46 = vfmsub213ps_avx512vl(auVar46,auVar50,auVar59);
        auVar50 = vfmsub213ps_avx512vl(auVar61,auVar50,auVar58);
        auVar54 = vfmsub213ps_avx512vl(auVar55,auVar54,auVar53);
        auVar49 = vfmsub213ps_avx512vl(auVar57,auVar49,auVar63);
        vandps_avx512vl(auVar41,auVar56);
        vandps_avx512vl(auVar58,auVar56);
        uVar30 = vcmpps_avx512vl(auVar49,auVar49,1);
        vandps_avx512vl(auVar43,auVar56);
        vandps_avx512vl(auVar53,auVar56);
        uVar31 = vcmpps_avx512vl(auVar49,auVar49,1);
        vandps_avx512vl(auVar59,auVar56);
        vandps_avx512vl(auVar63,auVar56);
        uVar33 = vcmpps_avx512vl(auVar49,auVar49,1);
        bVar27 = (bool)((byte)uVar30 & 1);
        local_2a60._0_4_ = (uint)bVar27 * auVar47._0_4_ | (uint)!bVar27 * auVar50._0_4_;
        bVar27 = (bool)((byte)(uVar30 >> 1) & 1);
        local_2a60._4_4_ = (uint)bVar27 * auVar47._4_4_ | (uint)!bVar27 * auVar50._4_4_;
        bVar27 = (bool)((byte)(uVar30 >> 2) & 1);
        local_2a60._8_4_ = (uint)bVar27 * auVar47._8_4_ | (uint)!bVar27 * auVar50._8_4_;
        bVar27 = (bool)((byte)(uVar30 >> 3) & 1);
        local_2a60._12_4_ = (uint)bVar27 * auVar47._12_4_ | (uint)!bVar27 * auVar50._12_4_;
        bVar27 = (bool)((byte)(uVar30 >> 4) & 1);
        local_2a60._16_4_ = (uint)bVar27 * auVar47._16_4_ | (uint)!bVar27 * auVar50._16_4_;
        bVar27 = (bool)((byte)(uVar30 >> 5) & 1);
        local_2a60._20_4_ = (uint)bVar27 * auVar47._20_4_ | (uint)!bVar27 * auVar50._20_4_;
        bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
        local_2a60._24_4_ = (uint)bVar27 * auVar47._24_4_ | (uint)!bVar27 * auVar50._24_4_;
        bVar27 = SUB81(uVar30 >> 7,0);
        local_2a60._28_4_ = (uint)bVar27 * auVar47._28_4_ | (uint)!bVar27 * auVar50._28_4_;
        bVar27 = (bool)((byte)uVar31 & 1);
        vVar64.field_0._0_4_ = (uint)bVar27 * auVar48._0_4_ | (uint)!bVar27 * auVar54._0_4_;
        bVar27 = (bool)((byte)(uVar31 >> 1) & 1);
        vVar64.field_0._4_4_ = (uint)bVar27 * auVar48._4_4_ | (uint)!bVar27 * auVar54._4_4_;
        bVar27 = (bool)((byte)(uVar31 >> 2) & 1);
        vVar64.field_0._8_4_ = (uint)bVar27 * auVar48._8_4_ | (uint)!bVar27 * auVar54._8_4_;
        bVar27 = (bool)((byte)(uVar31 >> 3) & 1);
        vVar64.field_0._12_4_ = (uint)bVar27 * auVar48._12_4_ | (uint)!bVar27 * auVar54._12_4_;
        bVar27 = (bool)((byte)(uVar31 >> 4) & 1);
        vVar64.field_0._16_4_ = (uint)bVar27 * auVar48._16_4_ | (uint)!bVar27 * auVar54._16_4_;
        bVar27 = (bool)((byte)(uVar31 >> 5) & 1);
        vVar64.field_0._20_4_ = (uint)bVar27 * auVar48._20_4_ | (uint)!bVar27 * auVar54._20_4_;
        bVar27 = (bool)((byte)(uVar31 >> 6) & 1);
        vVar64.field_0._24_4_ = (uint)bVar27 * auVar48._24_4_ | (uint)!bVar27 * auVar54._24_4_;
        bVar27 = SUB81(uVar31 >> 7,0);
        vVar64.field_0._28_4_ = (uint)bVar27 * auVar48._28_4_ | (uint)!bVar27 * auVar54._28_4_;
        bVar27 = (bool)((byte)uVar33 & 1);
        local_2a60._64_4_ = (float)((uint)bVar27 * auVar46._0_4_ | (uint)!bVar27 * auVar49._0_4_);
        bVar27 = (bool)((byte)(uVar33 >> 1) & 1);
        local_2a60._68_4_ = (float)((uint)bVar27 * auVar46._4_4_ | (uint)!bVar27 * auVar49._4_4_);
        bVar27 = (bool)((byte)(uVar33 >> 2) & 1);
        local_2a60._72_4_ = (float)((uint)bVar27 * auVar46._8_4_ | (uint)!bVar27 * auVar49._8_4_);
        bVar27 = (bool)((byte)(uVar33 >> 3) & 1);
        local_2a60._76_4_ = (float)((uint)bVar27 * auVar46._12_4_ | (uint)!bVar27 * auVar49._12_4_);
        bVar27 = (bool)((byte)(uVar33 >> 4) & 1);
        local_2a60._80_4_ = (float)((uint)bVar27 * auVar46._16_4_ | (uint)!bVar27 * auVar49._16_4_);
        bVar27 = (bool)((byte)(uVar33 >> 5) & 1);
        local_2a60._84_4_ = (float)((uint)bVar27 * auVar46._20_4_ | (uint)!bVar27 * auVar49._20_4_);
        bVar27 = (bool)((byte)(uVar33 >> 6) & 1);
        local_2a60._88_4_ = (float)((uint)bVar27 * auVar46._24_4_ | (uint)!bVar27 * auVar49._24_4_);
        bVar27 = SUB81(uVar33 >> 7,0);
        local_2a60._92_4_ = (uint)bVar27 * auVar46._28_4_ | (uint)!bVar27 * auVar49._28_4_;
        auVar54._4_4_ = fVar88 * local_2a60._68_4_;
        auVar54._0_4_ = fVar86 * local_2a60._64_4_;
        auVar54._8_4_ = fVar89 * local_2a60._72_4_;
        auVar54._12_4_ = fVar90 * local_2a60._76_4_;
        auVar54._16_4_ = fVar91 * local_2a60._80_4_;
        auVar54._20_4_ = fVar92 * local_2a60._84_4_;
        auVar54._24_4_ = fVar93 * local_2a60._88_4_;
        auVar54._28_4_ = auVar83._28_4_;
        auVar74 = vfmadd213ps_fma(auVar79,(undefined1  [32])vVar64.field_0,auVar54);
        auVar74 = vfmadd213ps_fma(auVar44,(undefined1  [32])local_2a60.field_0.x.field_0,
                                  ZEXT1632(auVar74));
        auVar82._0_4_ = auVar74._0_4_ + auVar74._0_4_;
        auVar82._4_4_ = auVar74._4_4_ + auVar74._4_4_;
        auVar82._8_4_ = auVar74._8_4_ + auVar74._8_4_;
        auVar82._12_4_ = auVar74._12_4_ + auVar74._12_4_;
        auVar79 = ZEXT1632(auVar82);
        in_ZMM7 = ZEXT3264(auVar79);
        auVar55._0_4_ = auVar76._0_4_ * local_2a60._64_4_;
        auVar55._4_4_ = auVar76._4_4_ * local_2a60._68_4_;
        auVar55._8_4_ = auVar76._8_4_ * local_2a60._72_4_;
        auVar55._12_4_ = auVar76._12_4_ * local_2a60._76_4_;
        auVar55._16_4_ = auVar76._16_4_ * local_2a60._80_4_;
        auVar55._20_4_ = auVar76._20_4_ * local_2a60._84_4_;
        auVar55._24_4_ = auVar76._24_4_ * local_2a60._88_4_;
        auVar55._28_4_ = 0;
        auVar74 = vfmadd213ps_fma(auVar75,(undefined1  [32])vVar64.field_0,auVar55);
        auVar15 = vfmadd213ps_fma(auVar73,(undefined1  [32])local_2a60.field_0.x.field_0,
                                  ZEXT1632(auVar74));
        auVar41 = vrcp14ps_avx512vl(auVar79);
        auVar43 = vxorps_avx512vl(auVar79,auVar62);
        auVar83 = auVar97._0_32_;
        auVar44 = vfnmadd213ps_avx512vl(auVar41,auVar79,auVar83);
        auVar74 = vfmadd132ps_fma(auVar44,auVar41,auVar41);
        in_ZMM9 = ZEXT1664(auVar74);
        auVar78._0_4_ = auVar74._0_4_ * (auVar15._0_4_ + auVar15._0_4_);
        auVar78._4_4_ = auVar74._4_4_ * (auVar15._4_4_ + auVar15._4_4_);
        auVar78._8_4_ = auVar74._8_4_ * (auVar15._8_4_ + auVar15._8_4_);
        auVar78._12_4_ = auVar74._12_4_ * (auVar15._12_4_ + auVar15._12_4_);
        local_2a00 = ZEXT1632(auVar78);
        auVar80 = ZEXT3264(local_2a00);
        uVar11 = vcmpps_avx512vl(local_2a00,*(undefined1 (*) [32])(ray + 0x100),2);
        uVar12 = vcmpps_avx512vl(local_2a00,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar14 = vcmpps_avx512vl(auVar79,auVar43,4);
        bVar37 = bVar37 & (byte)uVar11 & (byte)uVar12 & (byte)uVar14;
        if (bVar37 != 0) {
          pGVar3 = (context->scene->geometries).items[*(uint *)(lVar36 + local_2bc8)].ptr;
          local_2b40._0_8_ = pGVar3;
          uVar1 = pGVar3->mask;
          auVar81._4_4_ = uVar1;
          auVar81._0_4_ = uVar1;
          auVar81._8_4_ = uVar1;
          auVar81._12_4_ = uVar1;
          auVar81._16_4_ = uVar1;
          auVar81._20_4_ = uVar1;
          auVar81._24_4_ = uVar1;
          auVar81._28_4_ = uVar1;
          uVar11 = vptestmd_avx512vl(auVar81,*(undefined1 (*) [32])(ray + 0x120));
          bVar37 = bVar37 & (byte)uVar11;
          if (bVar37 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_2b80._0_4_ = (int)uVar39;
              auVar16._8_4_ = 0x219392ef;
              auVar16._0_8_ = 0x219392ef219392ef;
              auVar16._12_4_ = 0x219392ef;
              auVar16._16_4_ = 0x219392ef;
              auVar16._20_4_ = 0x219392ef;
              auVar16._24_4_ = 0x219392ef;
              auVar16._28_4_ = 0x219392ef;
              uVar39 = vcmpps_avx512vl(auVar42,auVar16,5);
              auVar41 = vrcp14ps_avx512vl(auVar42);
              auVar42 = vfnmadd213ps_avx512vl(auVar42,auVar41,auVar83);
              auVar41 = vfmadd132ps_avx512vl(auVar42,auVar41,auVar41);
              fVar90 = (float)((uint)((byte)uVar39 & 1) * auVar41._0_4_);
              fVar89 = (float)((uint)((byte)(uVar39 >> 1) & 1) * auVar41._4_4_);
              fVar88 = (float)((uint)((byte)(uVar39 >> 2) & 1) * auVar41._8_4_);
              fVar86 = (float)((uint)((byte)(uVar39 >> 3) & 1) * auVar41._12_4_);
              fVar91 = (float)((uint)((byte)(uVar39 >> 4) & 1) * auVar41._16_4_);
              fVar92 = (float)((uint)((byte)(uVar39 >> 5) & 1) * auVar41._20_4_);
              fVar93 = (float)((uint)((byte)(uVar39 >> 6) & 1) * auVar41._24_4_);
              auVar20._4_4_ = fVar89 * auVar51._4_4_;
              auVar20._0_4_ = fVar90 * auVar51._0_4_;
              auVar20._8_4_ = fVar88 * auVar51._8_4_;
              auVar20._12_4_ = fVar86 * auVar51._12_4_;
              auVar20._16_4_ = fVar91 * auVar51._16_4_;
              auVar20._20_4_ = fVar92 * auVar51._20_4_;
              auVar20._24_4_ = fVar93 * auVar51._24_4_;
              auVar20._28_4_ = auVar51._28_4_;
              auVar41 = vminps_avx512vl(auVar20,auVar83);
              auVar21._4_4_ = fVar89 * auVar52._4_4_;
              auVar21._0_4_ = fVar90 * auVar52._0_4_;
              auVar21._8_4_ = fVar88 * auVar52._8_4_;
              auVar21._12_4_ = fVar86 * auVar52._12_4_;
              auVar21._16_4_ = fVar91 * auVar52._16_4_;
              auVar21._20_4_ = fVar92 * auVar52._20_4_;
              auVar21._24_4_ = fVar93 * auVar52._24_4_;
              auVar21._28_4_ = auVar52._28_4_;
              auVar42 = vminps_avx512vl(auVar21,auVar83);
              local_29c0 = vsubps_avx512vl(auVar83,auVar41);
              local_29e0 = vsubps_avx512vl(auVar83,auVar42);
              local_2bc0.valid = local_2940;
              local_2bc0.geometryUserPtr = &local_2ac0;
              local_2bc0.context = local_2aa0;
              local_2bc0.ray = local_2a80;
              local_2ae0._0_4_ = *(undefined4 *)(lVar36 + 0x10 + local_2bc8);
              auVar80 = ZEXT1664(auVar78);
              in_ZMM7 = ZEXT1664(auVar82);
              in_ZMM9 = ZEXT1664(auVar74);
              local_2a60.field_0.y.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar64.field_0;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
              ::
              _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                          *)&local_2bc0,
                         (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                          *)&local_2a60.field_0);
              pRVar4 = context->user;
              local_29a0 = vpbroadcastd_avx512vl();
              local_29c0 = vpbroadcastd_avx512vl();
              local_2a60.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_2920;
              auVar41 = vpcmpeqd_avx2(local_29a0,local_29a0);
              local_2b50[1] = auVar41;
              *local_2b50 = auVar41;
              local_2980 = pRVar4->instID[0];
              local_2960 = pRVar4->instPrimID[0];
              local_2ae0 = *(undefined1 (*) [32])(ray + 0x100);
              auVar41 = vblendmps_avx512vl(local_2ae0,(undefined1  [32])local_2ac0);
              bVar27 = (bool)(bVar37 >> 1 & 1);
              bVar6 = (bool)(bVar37 >> 2 & 1);
              bVar7 = (bool)(bVar37 >> 3 & 1);
              bVar8 = (bool)(bVar37 >> 4 & 1);
              bVar9 = (bool)(bVar37 >> 5 & 1);
              bVar10 = (bool)(bVar37 >> 6 & 1);
              *(uint *)(ray + 0x100) =
                   (uint)(bVar37 & 1) * auVar41._0_4_ | !(bool)(bVar37 & 1) * local_2960;
              *(uint *)(ray + 0x104) = (uint)bVar27 * auVar41._4_4_ | !bVar27 * local_2960;
              *(uint *)(ray + 0x108) = (uint)bVar6 * auVar41._8_4_ | !bVar6 * local_2960;
              *(uint *)(ray + 0x10c) = (uint)bVar7 * auVar41._12_4_ | !bVar7 * local_2960;
              *(uint *)(ray + 0x110) = (uint)bVar8 * auVar41._16_4_ | !bVar8 * local_2960;
              *(uint *)(ray + 0x114) = (uint)bVar9 * auVar41._20_4_ | !bVar9 * local_2960;
              *(uint *)(ray + 0x118) = (uint)bVar10 * auVar41._24_4_ | !bVar10 * local_2960;
              *(uint *)(ray + 0x11c) =
                   (uint)(bVar37 >> 7) * auVar41._28_4_ | !(bool)(bVar37 >> 7) * local_2960;
              local_2b20 = vpmovm2d_avx512vl((ulong)bVar37);
              local_2bc0.valid = (int *)local_2b20;
              local_2bc0.geometryUserPtr = *(void **)(local_2b40._0_8_ + 0x18);
              local_2bc0.context = context->user;
              local_2bc0.hit = (RTCHitN *)&local_2a60;
              local_2bc0.N = 8;
              local_2bc0.ray = (RTCRayN *)ray;
              uStack_297c = local_2980;
              uStack_2978 = local_2980;
              uStack_2974 = local_2980;
              uStack_2970 = local_2980;
              uStack_296c = local_2980;
              uStack_2968 = local_2980;
              uStack_2964 = local_2980;
              uStack_295c = local_2960;
              uStack_2958 = local_2960;
              uStack_2954 = local_2960;
              uStack_2950 = local_2960;
              uStack_294c = local_2960;
              uStack_2948 = local_2960;
              uStack_2944 = local_2960;
              if (*(code **)(local_2b40._0_8_ + 0x48) != (code *)0x0) {
                auVar80 = ZEXT1664(auVar80._0_16_);
                in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                (**(code **)(local_2b40._0_8_ + 0x48))(&local_2bc0);
              }
              if (local_2b20 == (undefined1  [32])0x0) {
                uVar30 = 0;
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar96 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar97 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar98 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar99 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar100 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar101 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar95 = ZEXT3264(auVar41);
                uVar39 = (ulong)(uint)local_2b80._0_4_;
              }
              else {
                p_Var5 = context->args->filter;
                if (p_Var5 == (RTCFilterFunctionN)0x0) {
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar96 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar97 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar98 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar99 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar100 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar101 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar95 = ZEXT3264(auVar41);
                  uVar39 = (ulong)(uint)local_2b80._0_4_;
                }
                else {
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar96 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar97 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar98 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar99 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar100 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar101 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar95 = ZEXT3264(auVar41);
                  uVar39 = (ulong)(uint)local_2b80._0_4_;
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     ((*(byte *)(local_2b40._0_8_ + 0x3e) & 0x40) != 0)) {
                    auVar80 = ZEXT1664(auVar80._0_16_);
                    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                    in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                    (*p_Var5)(&local_2bc0);
                    uVar39 = (ulong)(uint)local_2b80._0_4_;
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar95 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                    auVar101 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar100 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar99 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar98 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar97 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar96 = ZEXT3264(auVar41);
                  }
                }
                uVar30 = vptestmd_avx512vl(local_2b20,local_2b20);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar27 = (bool)((byte)uVar30 & 1);
                auVar65._0_4_ =
                     (uint)bVar27 * auVar41._0_4_ | (uint)!bVar27 * *(int *)(local_2bc0.ray + 0x100)
                ;
                bVar27 = (bool)((byte)(uVar30 >> 1) & 1);
                auVar65._4_4_ =
                     (uint)bVar27 * auVar41._4_4_ |
                     (uint)!bVar27 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 4);
                bVar27 = (bool)((byte)(uVar30 >> 2) & 1);
                auVar65._8_4_ =
                     (uint)bVar27 * auVar41._8_4_ |
                     (uint)!bVar27 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 8);
                bVar27 = (bool)((byte)(uVar30 >> 3) & 1);
                auVar65._12_4_ =
                     (uint)bVar27 * auVar41._12_4_ |
                     (uint)!bVar27 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0xc);
                bVar27 = (bool)((byte)(uVar30 >> 4) & 1);
                auVar65._16_4_ =
                     (uint)bVar27 * auVar41._16_4_ |
                     (uint)!bVar27 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x10);
                bVar27 = (bool)((byte)(uVar30 >> 5) & 1);
                auVar65._20_4_ =
                     (uint)bVar27 * auVar41._20_4_ |
                     (uint)!bVar27 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x14);
                bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
                auVar65._24_4_ =
                     (uint)bVar27 * auVar41._24_4_ |
                     (uint)!bVar27 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x18);
                bVar27 = SUB81(uVar30 >> 7,0);
                auVar65._28_4_ =
                     (uint)bVar27 * auVar41._28_4_ |
                     (uint)!bVar27 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x1c);
                *(undefined1 (*) [32])(local_2bc0.ray + 0x100) = auVar65;
              }
              bVar37 = (byte)uVar30;
              auVar66._0_4_ =
                   (uint)(bVar37 & 1) * *(int *)local_2b90 |
                   (uint)!(bool)(bVar37 & 1) * local_2ae0._0_4_;
              bVar27 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar66._4_4_ =
                   (uint)bVar27 * *(int *)(local_2b90 + 4) | (uint)!bVar27 * local_2ae0._4_4_;
              bVar27 = (bool)((byte)(uVar30 >> 2) & 1);
              auVar66._8_4_ =
                   (uint)bVar27 * *(int *)(local_2b90 + 8) | (uint)!bVar27 * local_2ae0._8_4_;
              bVar27 = (bool)((byte)(uVar30 >> 3) & 1);
              auVar66._12_4_ =
                   (uint)bVar27 * *(int *)(local_2b90 + 0xc) | (uint)!bVar27 * local_2ae0._12_4_;
              bVar27 = (bool)((byte)(uVar30 >> 4) & 1);
              auVar66._16_4_ =
                   (uint)bVar27 * *(int *)(local_2b90 + 0x10) | (uint)!bVar27 * local_2ae0._16_4_;
              bVar27 = (bool)((byte)(uVar30 >> 5) & 1);
              auVar66._20_4_ =
                   (uint)bVar27 * *(int *)(local_2b90 + 0x14) | (uint)!bVar27 * local_2ae0._20_4_;
              bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
              auVar66._24_4_ =
                   (uint)bVar27 * *(int *)(local_2b90 + 0x18) | (uint)!bVar27 * local_2ae0._24_4_;
              bVar27 = (bool)((byte)(uVar30 >> 7) & 1);
              auVar66._28_4_ =
                   (uint)bVar27 * *(int *)(local_2b90 + 0x1c) | (uint)!bVar27 * local_2ae0._28_4_;
              *(undefined1 (*) [32])local_2b90 = auVar66;
            }
            uVar39 = CONCAT71((int7)(uVar39 >> 8),(byte)uVar39 & ~bVar37);
          }
        }
      }
      local_2bc8 = local_2bc8 + 4;
    } while ((char)uVar39 != '\0');
    uVar39 = 0;
LAB_01d09014:
    lVar29 = local_2b48 + 1;
    lVar36 = lVar36 + 0x60;
    bVar26 = bVar26 & (byte)uVar39;
  } while (bVar26 != 0);
  bVar26 = 0;
LAB_01d09034:
  bVar26 = (byte)local_2bf4 | ~bVar26;
  local_2bf4 = (uint)bVar26;
  if (bVar26 == 0xff) {
    local_2bf4 = 0xff;
    goto LAB_01d09187;
  }
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar27 = (bool)(bVar26 >> 1 & 1);
  bVar6 = (bool)(bVar26 >> 2 & 1);
  bVar7 = (bool)(bVar26 >> 3 & 1);
  bVar8 = (bool)(bVar26 >> 4 & 1);
  bVar9 = (bool)(bVar26 >> 5 & 1);
  bVar10 = (bool)(bVar26 >> 6 & 1);
  local_2740._4_4_ = (uint)bVar27 * auVar41._4_4_ | (uint)!bVar27 * local_2740._4_4_;
  local_2740._0_4_ =
       (uint)(bVar26 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar26 & 1) * local_2740._0_4_;
  local_2740._8_4_ = (uint)bVar6 * auVar41._8_4_ | (uint)!bVar6 * local_2740._8_4_;
  local_2740._12_4_ = (uint)bVar7 * auVar41._12_4_ | (uint)!bVar7 * local_2740._12_4_;
  local_2740._16_4_ = (uint)bVar8 * auVar41._16_4_ | (uint)!bVar8 * local_2740._16_4_;
  local_2740._20_4_ = (uint)bVar9 * auVar41._20_4_ | (uint)!bVar9 * local_2740._20_4_;
  local_2740._24_4_ = (uint)bVar10 * auVar41._24_4_ | (uint)!bVar10 * local_2740._24_4_;
  local_2740._28_4_ =
       (uint)(bVar26 >> 7) * auVar41._28_4_ | (uint)!(bool)(bVar26 >> 7) * local_2740._28_4_;
  goto LAB_01d07ddc;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }